

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive *pPVar2;
  undefined1 (*pauVar3) [12];
  Primitive PVar4;
  int iVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  float *pfVar10;
  undefined6 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined8 uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  int iVar32;
  undefined4 uVar33;
  ulong uVar34;
  undefined1 *puVar35;
  RTCFilterFunctionN p_Var36;
  RTCRayN *pRVar37;
  undefined4 uVar38;
  long lVar39;
  LinearSpace3fa *pLVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  float fVar52;
  float fVar53;
  float fVar83;
  float fVar85;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar84;
  float fVar86;
  float fVar87;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar75;
  undefined1 auVar76 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar77;
  undefined1 auVar78 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar79;
  undefined1 auVar80 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar81;
  short sVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar127;
  float fVar130;
  vfloat4 v_1;
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar128;
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar135;
  float fVar136;
  float fVar145;
  float fVar147;
  undefined1 auVar137 [16];
  float fVar146;
  float fVar148;
  float fVar149;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar150;
  float fVar151;
  float fVar164;
  float fVar166;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar165;
  float fVar167;
  float fVar168;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar182;
  float fVar185;
  vfloat4 v;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar183;
  float fVar184;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar190;
  float fVar191;
  float fVar201;
  float fVar203;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar202;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar205;
  float fVar223;
  float fVar225;
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar219;
  float fVar224;
  float fVar226;
  float fVar227;
  undefined1 auVar220 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar221;
  undefined1 auVar222 [16];
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar230 [16];
  float fVar235;
  float fVar236;
  float fVar239;
  float fVar240;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar253 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar270;
  float fVar273;
  undefined1 auVar262 [16];
  float fVar276;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar271;
  float fVar272;
  float fVar274;
  float fVar275;
  float fVar277;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar278;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 local_538 [8];
  float fStack_530;
  undefined4 uStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  undefined1 local_4f8 [8];
  undefined8 uStack_4f0;
  undefined4 uStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  vbool<4> valid;
  undefined1 local_428 [16];
  LinearSpace3fa *local_418;
  Precalculations *local_410;
  Primitive *local_408;
  ulong local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  RTCFilterFunctionNArguments args;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined2 uVar82;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 uVar126;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  
  PVar4 = prim[1];
  uVar34 = (ulong)(byte)PVar4;
  pPVar2 = prim + uVar34 * 0x19 + 6;
  fVar166 = *(float *)(pPVar2 + 0xc);
  uVar38 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar169 = (*(float *)(ray + k * 4) - *(float *)pPVar2) * fVar166;
  fVar182 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar2 + 4)) * fVar166;
  fVar185 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar2 + 8)) * fVar166;
  fVar150 = *(float *)(ray + k * 4 + 0x40) * fVar166;
  fVar164 = *(float *)(ray + k * 4 + 0x50) * fVar166;
  fVar166 = *(float *)(ray + k * 4 + 0x60) * fVar166;
  uVar33 = *(undefined4 *)(prim + uVar34 * 4 + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar42;
  auVar94._12_2_ = uVar82;
  auVar94._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar42;
  auVar93._10_2_ = uVar82;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar82;
  auVar92._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar12._4_8_ = auVar92._8_8_;
  auVar12._2_2_ = uVar82;
  auVar12._0_2_ = uVar82;
  fVar135 = (float)((int)sVar88 >> 8);
  fVar145 = (float)(auVar12._0_4_ >> 0x18);
  fVar147 = (float)(auVar92._8_4_ >> 0x18);
  uVar33 = *(undefined4 *)(prim + uVar34 * 5 + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar42;
  auVar97._12_2_ = uVar82;
  auVar97._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar42;
  auVar96._10_2_ = uVar82;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar82;
  auVar95._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar13._4_8_ = auVar95._8_8_;
  auVar13._2_2_ = uVar82;
  auVar13._0_2_ = uVar82;
  fVar190 = (float)((int)sVar88 >> 8);
  fVar201 = (float)(auVar13._0_4_ >> 0x18);
  fVar203 = (float)(auVar95._8_4_ >> 0x18);
  uVar33 = *(undefined4 *)(prim + uVar34 * 6 + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar100._8_4_ = 0;
  auVar100._0_8_ = uVar42;
  auVar100._12_2_ = uVar82;
  auVar100._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar42;
  auVar99._10_2_ = uVar82;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = uVar82;
  auVar98._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar14._4_8_ = auVar98._8_8_;
  auVar14._2_2_ = uVar82;
  auVar14._0_2_ = uVar82;
  fVar236 = (float)((int)sVar88 >> 8);
  fVar239 = (float)(auVar14._0_4_ >> 0x18);
  fVar240 = (float)(auVar98._8_4_ >> 0x18);
  uVar33 = *(undefined4 *)(prim + uVar34 * 0xb + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar103._8_4_ = 0;
  auVar103._0_8_ = uVar42;
  auVar103._12_2_ = uVar82;
  auVar103._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._8_2_ = 0;
  auVar102._0_8_ = uVar42;
  auVar102._10_2_ = uVar82;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._8_2_ = uVar82;
  auVar101._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar15._4_8_ = auVar101._8_8_;
  auVar15._2_2_ = uVar82;
  auVar15._0_2_ = uVar82;
  fVar52 = (float)((int)sVar88 >> 8);
  fVar83 = (float)(auVar15._0_4_ >> 0x18);
  fVar85 = (float)(auVar101._8_4_ >> 0x18);
  uVar33 = *(undefined4 *)(prim + uVar34 * 0xc + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar42;
  auVar208._12_2_ = uVar82;
  auVar208._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar42;
  auVar207._10_2_ = uVar82;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar82;
  auVar206._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar16._4_8_ = auVar206._8_8_;
  auVar16._2_2_ = uVar82;
  auVar16._0_2_ = uVar82;
  fVar228 = (float)((int)sVar88 >> 8);
  fVar231 = (float)(auVar16._0_4_ >> 0x18);
  fVar233 = (float)(auVar206._8_4_ >> 0x18);
  uVar33 = *(undefined4 *)(prim + uVar34 * 0xd + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar42;
  auVar211._12_2_ = uVar82;
  auVar211._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar42;
  auVar210._10_2_ = uVar82;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar82;
  auVar209._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar17._4_8_ = auVar209._8_8_;
  auVar17._2_2_ = uVar82;
  auVar17._0_2_ = uVar82;
  fVar248 = (float)((int)sVar88 >> 8);
  fVar249 = (float)(auVar17._0_4_ >> 0x18);
  fVar250 = (float)(auVar209._8_4_ >> 0x18);
  uVar33 = *(undefined4 *)(prim + uVar34 * 0x12 + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar42;
  auVar214._12_2_ = uVar82;
  auVar214._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar42;
  auVar213._10_2_ = uVar82;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar82;
  auVar212._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar18._4_8_ = auVar212._8_8_;
  auVar18._2_2_ = uVar82;
  auVar18._0_2_ = uVar82;
  fVar241 = (float)((int)sVar88 >> 8);
  fVar244 = (float)(auVar18._0_4_ >> 0x18);
  fVar245 = (float)(auVar212._8_4_ >> 0x18);
  uVar33 = *(undefined4 *)(prim + uVar34 * 0x13 + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar42;
  auVar217._12_2_ = uVar82;
  auVar217._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar42;
  auVar216._10_2_ = uVar82;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar82;
  auVar215._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar19._4_8_ = auVar215._8_8_;
  auVar19._2_2_ = uVar82;
  auVar19._0_2_ = uVar82;
  fVar251 = (float)((int)sVar88 >> 8);
  fVar254 = (float)(auVar19._0_4_ >> 0x18);
  fVar256 = (float)(auVar215._8_4_ >> 0x18);
  uVar33 = *(undefined4 *)(prim + uVar34 * 0x14 + 6);
  uVar126 = (undefined1)((uint)uVar33 >> 0x18);
  uVar82 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar33 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar82,uVar126),CONCAT14(uVar126,uVar33));
  uVar126 = (undefined1)((uint)uVar33 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar126),uVar126);
  sVar88 = CONCAT11((char)uVar33,(char)uVar33);
  uVar42 = CONCAT62(uVar11,sVar88);
  auVar264._8_4_ = 0;
  auVar264._0_8_ = uVar42;
  auVar264._12_2_ = uVar82;
  auVar264._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._8_2_ = 0;
  auVar263._0_8_ = uVar42;
  auVar263._10_2_ = uVar82;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._8_2_ = uVar82;
  auVar262._0_8_ = uVar42;
  uVar82 = (undefined2)uVar11;
  auVar20._4_8_ = auVar262._8_8_;
  auVar20._2_2_ = uVar82;
  auVar20._0_2_ = uVar82;
  fVar89 = (float)((int)sVar88 >> 8);
  fVar127 = (float)(auVar20._0_4_ >> 0x18);
  fVar130 = (float)(auVar262._8_4_ >> 0x18);
  fVar278 = fVar150 * fVar135 + fVar164 * fVar190 + fVar166 * fVar236;
  fVar287 = fVar150 * fVar145 + fVar164 * fVar201 + fVar166 * fVar239;
  fVar288 = fVar150 * fVar147 + fVar164 * fVar203 + fVar166 * fVar240;
  fVar289 = fVar150 * (float)(auVar93._12_4_ >> 0x18) +
            fVar164 * (float)(auVar96._12_4_ >> 0x18) + fVar166 * (float)(auVar99._12_4_ >> 0x18);
  fVar259 = fVar150 * fVar52 + fVar164 * fVar228 + fVar166 * fVar248;
  fVar270 = fVar150 * fVar83 + fVar164 * fVar231 + fVar166 * fVar249;
  fVar273 = fVar150 * fVar85 + fVar164 * fVar233 + fVar166 * fVar250;
  fVar276 = fVar150 * (float)(auVar102._12_4_ >> 0x18) +
            fVar164 * (float)(auVar207._12_4_ >> 0x18) + fVar166 * (float)(auVar210._12_4_ >> 0x18);
  fVar204 = fVar150 * fVar241 + fVar164 * fVar251 + fVar166 * fVar89;
  fVar223 = fVar150 * fVar244 + fVar164 * fVar254 + fVar166 * fVar127;
  fVar225 = fVar150 * fVar245 + fVar164 * fVar256 + fVar166 * fVar130;
  fVar150 = fVar150 * (float)(auVar213._12_4_ >> 0x18) +
            fVar164 * (float)(auVar216._12_4_ >> 0x18) + fVar166 * (float)(auVar263._12_4_ >> 0x18);
  fVar190 = fVar135 * fVar169 + fVar190 * fVar182 + fVar236 * fVar185;
  fVar201 = fVar145 * fVar169 + fVar201 * fVar182 + fVar239 * fVar185;
  fVar203 = fVar147 * fVar169 + fVar203 * fVar182 + fVar240 * fVar185;
  fVar236 = (float)(auVar93._12_4_ >> 0x18) * fVar169 +
            (float)(auVar96._12_4_ >> 0x18) * fVar182 + (float)(auVar99._12_4_ >> 0x18) * fVar185;
  fVar239 = fVar52 * fVar169 + fVar228 * fVar182 + fVar248 * fVar185;
  fVar240 = fVar83 * fVar169 + fVar231 * fVar182 + fVar249 * fVar185;
  fVar248 = fVar85 * fVar169 + fVar233 * fVar182 + fVar250 * fVar185;
  fVar249 = (float)(auVar102._12_4_ >> 0x18) * fVar169 +
            (float)(auVar207._12_4_ >> 0x18) * fVar182 + (float)(auVar210._12_4_ >> 0x18) * fVar185;
  fVar228 = fVar169 * fVar241 + fVar182 * fVar251 + fVar185 * fVar89;
  fVar231 = fVar169 * fVar244 + fVar182 * fVar254 + fVar185 * fVar127;
  fVar233 = fVar169 * fVar245 + fVar182 * fVar256 + fVar185 * fVar130;
  fVar169 = fVar169 * (float)(auVar213._12_4_ >> 0x18) +
            fVar182 * (float)(auVar216._12_4_ >> 0x18) + fVar185 * (float)(auVar263._12_4_ >> 0x18);
  fVar166 = (float)DAT_01f4bd50;
  fVar52 = DAT_01f4bd50._4_4_;
  fVar83 = DAT_01f4bd50._8_4_;
  fVar85 = DAT_01f4bd50._12_4_;
  uVar46 = -(uint)(fVar166 <= ABS(fVar278));
  uVar47 = -(uint)(fVar52 <= ABS(fVar287));
  uVar48 = -(uint)(fVar83 <= ABS(fVar288));
  uVar50 = -(uint)(fVar85 <= ABS(fVar289));
  auVar279._0_4_ = (uint)fVar278 & uVar46;
  auVar279._4_4_ = (uint)fVar287 & uVar47;
  auVar279._8_4_ = (uint)fVar288 & uVar48;
  auVar279._12_4_ = (uint)fVar289 & uVar50;
  auVar172._0_4_ = ~uVar46 & (uint)fVar166;
  auVar172._4_4_ = ~uVar47 & (uint)fVar52;
  auVar172._8_4_ = ~uVar48 & (uint)fVar83;
  auVar172._12_4_ = ~uVar50 & (uint)fVar85;
  auVar172 = auVar172 | auVar279;
  uVar46 = -(uint)(fVar166 <= ABS(fVar259));
  uVar47 = -(uint)(fVar52 <= ABS(fVar270));
  uVar48 = -(uint)(fVar83 <= ABS(fVar273));
  uVar50 = -(uint)(fVar85 <= ABS(fVar276));
  auVar265._0_4_ = (uint)fVar259 & uVar46;
  auVar265._4_4_ = (uint)fVar270 & uVar47;
  auVar265._8_4_ = (uint)fVar273 & uVar48;
  auVar265._12_4_ = (uint)fVar276 & uVar50;
  auVar192._0_4_ = ~uVar46 & (uint)fVar166;
  auVar192._4_4_ = ~uVar47 & (uint)fVar52;
  auVar192._8_4_ = ~uVar48 & (uint)fVar83;
  auVar192._12_4_ = ~uVar50 & (uint)fVar85;
  auVar192 = auVar192 | auVar265;
  uVar46 = -(uint)(fVar166 <= ABS(fVar204));
  uVar47 = -(uint)(fVar52 <= ABS(fVar223));
  uVar48 = -(uint)(fVar83 <= ABS(fVar225));
  uVar50 = -(uint)(fVar85 <= ABS(fVar150));
  auVar218._0_4_ = (uint)fVar204 & uVar46;
  auVar218._4_4_ = (uint)fVar223 & uVar47;
  auVar218._8_4_ = (uint)fVar225 & uVar48;
  auVar218._12_4_ = (uint)fVar150 & uVar50;
  auVar242._0_4_ = ~uVar46 & (uint)fVar166;
  auVar242._4_4_ = ~uVar47 & (uint)fVar52;
  auVar242._8_4_ = ~uVar48 & (uint)fVar83;
  auVar242._12_4_ = ~uVar50 & (uint)fVar85;
  auVar242 = auVar242 | auVar218;
  auVar54 = rcpps(_DAT_01f4bd50,auVar172);
  fVar166 = auVar54._0_4_;
  fVar85 = auVar54._4_4_;
  fVar130 = auVar54._8_4_;
  fVar147 = auVar54._12_4_;
  fVar166 = (1.0 - auVar172._0_4_ * fVar166) * fVar166 + fVar166;
  fVar85 = (1.0 - auVar172._4_4_ * fVar85) * fVar85 + fVar85;
  fVar130 = (1.0 - auVar172._8_4_ * fVar130) * fVar130 + fVar130;
  fVar147 = (1.0 - auVar172._12_4_ * fVar147) * fVar147 + fVar147;
  auVar54 = rcpps(auVar54,auVar192);
  fVar52 = auVar54._0_4_;
  fVar89 = auVar54._4_4_;
  fVar135 = auVar54._8_4_;
  fVar150 = auVar54._12_4_;
  fVar52 = (1.0 - auVar192._0_4_ * fVar52) * fVar52 + fVar52;
  fVar89 = (1.0 - auVar192._4_4_ * fVar89) * fVar89 + fVar89;
  fVar135 = (1.0 - auVar192._8_4_ * fVar135) * fVar135 + fVar135;
  fVar150 = (1.0 - auVar192._12_4_ * fVar150) * fVar150 + fVar150;
  auVar54 = rcpps(auVar54,auVar242);
  fVar83 = auVar54._0_4_;
  fVar127 = auVar54._4_4_;
  fVar145 = auVar54._8_4_;
  fVar164 = auVar54._12_4_;
  fVar83 = (1.0 - auVar242._0_4_ * fVar83) * fVar83 + fVar83;
  fVar127 = (1.0 - auVar242._4_4_ * fVar127) * fVar127 + fVar127;
  fVar145 = (1.0 - auVar242._8_4_ * fVar145) * fVar145 + fVar145;
  fVar164 = (1.0 - auVar242._12_4_ * fVar164) * fVar164 + fVar164;
  uVar42 = *(ulong *)(prim + uVar34 * 7 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar42;
  auVar55._12_2_ = uVar82;
  auVar55._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar194._12_4_ = auVar55._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar42;
  auVar194._10_2_ = uVar82;
  auVar54._10_6_ = auVar194._10_6_;
  auVar54._8_2_ = uVar82;
  auVar54._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar21._4_8_ = auVar54._8_8_;
  auVar21._2_2_ = uVar82;
  auVar21._0_2_ = uVar82;
  auVar173._0_8_ =
       CONCAT44(((float)(auVar21._0_4_ >> 0x10) - fVar201) * fVar85,
                ((float)(int)(short)uVar42 - fVar190) * fVar166);
  auVar173._8_4_ = ((float)(auVar54._8_4_ >> 0x10) - fVar203) * fVar130;
  auVar173._12_4_ = ((float)(auVar194._12_4_ >> 0x10) - fVar236) * fVar147;
  uVar42 = *(ulong *)(prim + uVar34 * 9 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar42;
  auVar58._12_2_ = uVar82;
  auVar58._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar42;
  auVar57._10_2_ = uVar82;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar82;
  auVar56._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar22._4_8_ = auVar56._8_8_;
  auVar22._2_2_ = uVar82;
  auVar22._0_2_ = uVar82;
  aVar219._0_4_ = ((float)(int)(short)uVar42 - fVar190) * fVar166;
  aVar219._4_4_ = ((float)(auVar22._0_4_ >> 0x10) - fVar201) * fVar85;
  aVar219._8_4_ = ((float)(auVar56._8_4_ >> 0x10) - fVar203) * fVar130;
  aVar219._12_4_ = ((float)(auVar57._12_4_ >> 0x10) - fVar236) * fVar147;
  uVar42 = *(ulong *)(prim + uVar34 * 0xe + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar42;
  auVar61._12_2_ = uVar82;
  auVar61._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar42;
  auVar60._10_2_ = uVar82;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar82;
  auVar59._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar23._4_8_ = auVar59._8_8_;
  auVar23._2_2_ = uVar82;
  auVar23._0_2_ = uVar82;
  auVar137._0_8_ =
       CONCAT44(((float)(auVar23._0_4_ >> 0x10) - fVar240) * fVar89,
                ((float)(int)(short)uVar42 - fVar239) * fVar52);
  auVar137._8_4_ = ((float)(auVar59._8_4_ >> 0x10) - fVar248) * fVar135;
  auVar137._12_4_ = ((float)(auVar60._12_4_ >> 0x10) - fVar249) * fVar150;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar42;
  auVar64._12_2_ = uVar82;
  auVar64._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar42;
  auVar63._10_2_ = uVar82;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar82;
  auVar62._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar24._4_8_ = auVar62._8_8_;
  auVar24._2_2_ = uVar82;
  auVar24._0_2_ = uVar82;
  auVar237._0_4_ = ((float)(int)(short)uVar42 - fVar239) * fVar52;
  auVar237._4_4_ = ((float)(auVar24._0_4_ >> 0x10) - fVar240) * fVar89;
  auVar237._8_4_ = ((float)(auVar62._8_4_ >> 0x10) - fVar248) * fVar135;
  auVar237._12_4_ = ((float)(auVar63._12_4_ >> 0x10) - fVar249) * fVar150;
  uVar42 = *(ulong *)(prim + uVar34 * 0x15 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar42;
  auVar67._12_2_ = uVar82;
  auVar67._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar42;
  auVar66._10_2_ = uVar82;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar82;
  auVar65._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar25._4_8_ = auVar65._8_8_;
  auVar25._2_2_ = uVar82;
  auVar25._0_2_ = uVar82;
  auVar104._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar231) * fVar127,
                ((float)(int)(short)uVar42 - fVar228) * fVar83);
  auVar104._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar233) * fVar145;
  auVar104._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar169) * fVar164;
  uVar42 = *(ulong *)(prim + uVar34 * 0x17 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar42;
  auVar70._12_2_ = uVar82;
  auVar70._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar42;
  auVar69._10_2_ = uVar82;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar82;
  auVar68._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar26._4_8_ = auVar68._8_8_;
  auVar26._2_2_ = uVar82;
  auVar26._0_2_ = uVar82;
  auVar71._0_4_ = ((float)(int)(short)uVar42 - fVar228) * fVar83;
  auVar71._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar231) * fVar127;
  auVar71._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar233) * fVar145;
  auVar71._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar169) * fVar164;
  auVar193._8_4_ = auVar173._8_4_;
  auVar193._0_8_ = auVar173._0_8_;
  auVar193._12_4_ = auVar173._12_4_;
  auVar194 = minps(auVar193,(undefined1  [16])aVar219);
  auVar152._8_4_ = auVar137._8_4_;
  auVar152._0_8_ = auVar137._0_8_;
  auVar152._12_4_ = auVar137._12_4_;
  auVar54 = minps(auVar152,auVar237);
  auVar194 = maxps(auVar194,auVar54);
  auVar153._8_4_ = auVar104._8_4_;
  auVar153._0_8_ = auVar104._0_8_;
  auVar153._12_4_ = auVar104._12_4_;
  auVar54 = minps(auVar153,auVar71);
  auVar230._4_4_ = uVar38;
  auVar230._0_4_ = uVar38;
  auVar230._8_4_ = uVar38;
  auVar230._12_4_ = uVar38;
  auVar54 = maxps(auVar54,auVar230);
  auVar54 = maxps(auVar194,auVar54);
  local_48 = auVar54._0_4_ * 0.99999964;
  fStack_44 = auVar54._4_4_ * 0.99999964;
  fStack_40 = auVar54._8_4_ * 0.99999964;
  fStack_3c = auVar54._12_4_ * 0.99999964;
  auVar194 = maxps(auVar173,(undefined1  [16])aVar219);
  auVar54 = maxps(auVar137,auVar237);
  auVar194 = minps(auVar194,auVar54);
  auVar54 = maxps(auVar104,auVar71);
  uVar38 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar72._4_4_ = uVar38;
  auVar72._0_4_ = uVar38;
  auVar72._8_4_ = uVar38;
  auVar72._12_4_ = uVar38;
  auVar54 = minps(auVar54,auVar72);
  auVar54 = minps(auVar194,auVar54);
  auVar105._0_4_ = -(uint)(PVar4 != (Primitive)0x0 && local_48 <= auVar54._0_4_ * 1.0000004);
  auVar105._4_4_ = -(uint)(1 < (byte)PVar4 && fStack_44 <= auVar54._4_4_ * 1.0000004);
  auVar105._8_4_ = -(uint)(2 < (byte)PVar4 && fStack_40 <= auVar54._8_4_ * 1.0000004);
  auVar105._12_4_ = -(uint)(3 < (byte)PVar4 && fStack_3c <= auVar54._12_4_ * 1.0000004);
  uVar46 = movmskps((uint)(byte)PVar4,auVar105);
  pLVar40 = pre->ray_space + k;
  local_3f8 = mm_lookupmask_ps._0_8_;
  uStack_3f0 = mm_lookupmask_ps._8_8_;
  lVar39 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_418 = pLVar40;
  local_410 = pre;
  local_408 = prim;
  for (; uVar42 = (ulong)uVar46, uVar42 != 0; uVar46 = (uint)uVar42 & uVar46) {
    lVar44 = 0;
    if (uVar42 != 0) {
      for (; (uVar46 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
      }
    }
    uVar42 = uVar42 - 1 & uVar42;
    uVar46 = *(uint *)(prim + 2);
    uStack_2e0._0_4_ = *(uint *)(prim + lVar44 * 4 + 6);
    local_400 = (ulong)(uint)uStack_2e0;
    pGVar6 = (context->scene->geometries).items[uVar46].ptr;
    uVar34 = *(ulong *)&pGVar6->field_0x58;
    _Var7 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    uVar43 = (ulong)*(uint *)(uVar34 + _Var7 * local_400);
    p_Var36 = pGVar6[1].intersectionFilterN;
    lVar44 = *(long *)&pGVar6[1].time_range.upper;
    pfVar1 = (float *)(lVar44 + (long)p_Var36 * uVar43);
    fVar166 = *pfVar1;
    fVar52 = pfVar1[1];
    uVar9 = *(undefined8 *)pfVar1;
    bhit.curve3D.v0.field_0._0_8_ = *(undefined8 *)pfVar1;
    pfVar10 = pfVar1 + 2;
    fVar83 = *pfVar10;
    fVar85 = pfVar1[3];
    uVar27 = *(undefined8 *)pfVar10;
    bhit.curve3D.v0.field_0._8_8_ = *(undefined8 *)pfVar10;
    pfVar1 = (float *)(lVar44 + (uVar43 + 1) * (long)p_Var36);
    fVar89 = *pfVar1;
    fVar127 = pfVar1[1];
    fVar130 = pfVar1[2];
    fVar135 = pfVar1[3];
    pfVar1 = (float *)(lVar44 + (uVar43 + 2) * (long)p_Var36);
    local_3d8 = *pfVar1;
    fStack_3d4 = pfVar1[1];
    bhit.curve3D.v2.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_3d0 = pfVar1[2];
    fVar145 = pfVar1[3];
    bhit.curve3D.v2.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    lVar45 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
      }
    }
    pfVar1 = (float *)(lVar44 + (uVar43 + 3) * (long)p_Var36);
    local_3e8 = *pfVar1;
    fStack_3e4 = pfVar1[1];
    bhit.curve3D.v3.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_3e0 = pfVar1[2];
    fVar147 = pfVar1[3];
    bhit.curve3D.v3.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    if ((uVar42 != 0) && (uVar43 = uVar42 - 1 & uVar42, uVar43 != 0)) {
      lVar44 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
        }
      }
      uVar34 = (ulong)*(uint *)(uVar34 + _Var7 * *(uint *)(prim + lVar44 * 4 + 6));
    }
    iVar5 = (int)pGVar6[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar150 = *(float *)(ray + k * 4);
    fVar164 = *(float *)(ray + k * 4 + 0x10);
    fVar190 = *(float *)(ray + k * 4 + 0x20);
    fVar204 = fVar166 - fVar150;
    fVar223 = fVar52 - fVar164;
    fVar225 = fVar83 - fVar190;
    fVar201 = (pLVar40->vx).field_0.m128[0];
    fVar203 = (pLVar40->vx).field_0.m128[1];
    fVar236 = (pLVar40->vx).field_0.m128[2];
    fVar228 = (pLVar40->vy).field_0.m128[0];
    fVar231 = (pLVar40->vy).field_0.m128[1];
    fVar233 = (pLVar40->vy).field_0.m128[2];
    fVar169 = (pLVar40->vz).field_0.m128[0];
    fVar182 = (pLVar40->vz).field_0.m128[1];
    fVar185 = (pLVar40->vz).field_0.m128[2];
    fVar251 = fVar204 * fVar201 + fVar223 * fVar228 + fVar225 * fVar169;
    fVar254 = fVar204 * fVar203 + fVar223 * fVar231 + fVar225 * fVar182;
    fVar256 = fVar204 * fVar236 + fVar223 * fVar233 + fVar225 * fVar185;
    fVar204 = fVar89 - fVar150;
    fVar223 = fVar127 - fVar164;
    fVar225 = fVar130 - fVar190;
    fVar241 = fVar204 * fVar201 + fVar223 * fVar228 + fVar225 * fVar169;
    local_3b8 = fVar204 * fVar203 + fVar223 * fVar231 + fVar225 * fVar182;
    fVar244 = fVar204 * fVar236 + fVar223 * fVar233 + fVar225 * fVar185;
    fVar204 = local_3d8 - fVar150;
    fVar223 = fStack_3d4 - fVar164;
    fVar225 = fStack_3d0 - fVar190;
    fVar245 = fVar204 * fVar201 + fVar223 * fVar228 + fVar225 * fVar169;
    fVar250 = fVar204 * fVar203 + fVar223 * fVar231 + fVar225 * fVar182;
    fVar204 = fVar204 * fVar236 + fVar223 * fVar233 + fVar225 * fVar185;
    fVar150 = local_3e8 - fVar150;
    fVar164 = fStack_3e4 - fVar164;
    fVar190 = fStack_3e0 - fVar190;
    fVar201 = fVar150 * fVar201 + fVar164 * fVar228 + fVar190 * fVar169;
    fVar203 = fVar150 * fVar203 + fVar164 * fVar231 + fVar190 * fVar182;
    fVar164 = fVar150 * fVar236 + fVar164 * fVar233 + fVar190 * fVar185;
    auVar280._0_8_ = CONCAT44(fVar254,fVar251) & 0x7fffffff7fffffff;
    auVar280._8_4_ = ABS(fVar256);
    auVar280._12_4_ = ABS(fVar85);
    auVar174._0_8_ = CONCAT44(local_3b8,fVar241) & 0x7fffffff7fffffff;
    auVar174._8_4_ = ABS(fVar244);
    auVar174._12_4_ = ABS(fVar135);
    auVar194 = maxps(auVar280,auVar174);
    auVar195._0_8_ = CONCAT44(fVar250,fVar245) & 0x7fffffff7fffffff;
    auVar195._8_4_ = ABS(fVar204);
    auVar195._12_4_ = ABS(fVar145);
    auVar106._0_8_ = CONCAT44(fVar203,fVar201) & 0x7fffffff7fffffff;
    auVar106._8_4_ = ABS(fVar164);
    auVar106._12_4_ = ABS(fVar147);
    auVar54 = maxps(auVar195,auVar106);
    auVar54 = maxps(auVar194,auVar54);
    fVar150 = auVar54._4_4_;
    if (auVar54._4_4_ <= auVar54._0_4_) {
      fVar150 = auVar54._0_4_;
    }
    auVar281._8_8_ = auVar54._8_8_;
    auVar281._0_8_ = auVar54._8_8_;
    fVar190 = (float)iVar5;
    if (auVar54._8_4_ <= fVar150) {
      auVar281._0_4_ = fVar150;
    }
    lVar44 = (long)iVar5 * 0x44;
    fVar236 = *(float *)(catmullrom_basis0 + lVar44 + 0x908);
    fVar228 = *(float *)(catmullrom_basis0 + lVar44 + 0x90c);
    fVar231 = *(float *)(catmullrom_basis0 + lVar44 + 0x910);
    fVar233 = *(float *)(catmullrom_basis0 + lVar44 + 0x914);
    fVar150 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar44 + 0xd8c);
    fVar169 = *(float *)(catmullrom_basis0 + lVar44 + 0xd90);
    fVar182 = *(float *)(catmullrom_basis0 + lVar44 + 0xd94);
    auVar12 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar44 + 0xd8c);
    fVar185 = *(float *)(catmullrom_basis0 + lVar44 + 0xd98);
    fVar223 = *(float *)(catmullrom_basis0 + lVar44 + 0x484);
    fVar225 = *(float *)(catmullrom_basis0 + lVar44 + 0x488);
    fVar259 = *(float *)(catmullrom_basis0 + lVar44 + 0x48c);
    fVar270 = *(float *)(catmullrom_basis0 + lVar44 + 0x490);
    fVar273 = *(float *)(catmullrom_basis0 + lVar44);
    fVar276 = *(float *)(catmullrom_basis0 + lVar44 + 4);
    fVar278 = *(float *)(catmullrom_basis0 + lVar44 + 8);
    fVar287 = *(float *)(catmullrom_basis0 + lVar44 + 0xc);
    fVar151 = fVar251 * fVar273 + fVar241 * fVar223 + fVar245 * fVar236 + fVar201 * fVar150;
    fVar165 = fVar251 * fVar276 + fVar241 * fVar225 + fVar245 * fVar228 + fVar201 * fVar169;
    fVar167 = fVar251 * fVar278 + fVar241 * fVar259 + fVar245 * fVar231 + fVar201 * fVar182;
    fVar168 = fVar251 * fVar287 + fVar241 * fVar270 + fVar245 * fVar233 + fVar201 * fVar185;
    fVar292 = fVar254 * fVar273 + local_3b8 * fVar223 + fVar250 * fVar236 + fVar203 * fVar150;
    fVar294 = fVar254 * fVar276 + local_3b8 * fVar225 + fVar250 * fVar228 + fVar203 * fVar169;
    fVar297 = fVar254 * fVar278 + local_3b8 * fVar259 + fVar250 * fVar231 + fVar203 * fVar182;
    fVar300 = fVar254 * fVar287 + local_3b8 * fVar270 + fVar250 * fVar233 + fVar203 * fVar185;
    auVar266._0_4_ = fVar85 * fVar273 + fVar135 * fVar223 + fVar145 * fVar236 + fVar147 * fVar150;
    auVar266._4_4_ = fVar85 * fVar276 + fVar135 * fVar225 + fVar145 * fVar228 + fVar147 * fVar169;
    auVar266._8_4_ = fVar85 * fVar278 + fVar135 * fVar259 + fVar145 * fVar231 + fVar147 * fVar182;
    auVar266._12_4_ = fVar85 * fVar287 + fVar135 * fVar270 + fVar145 * fVar233 + fVar147 * fVar185;
    fVar169 = *(float *)(catmullrom_basis1 + lVar44 + 0xd8c);
    fVar182 = *(float *)(catmullrom_basis1 + lVar44 + 0xd90);
    fVar288 = *(float *)(catmullrom_basis1 + lVar44 + 0xd94);
    fVar289 = *(float *)(catmullrom_basis1 + lVar44 + 0xd98);
    fVar150 = *(float *)*(undefined1 (*) [12])(catmullrom_basis1 + lVar44 + 0x908);
    fVar171 = *(float *)(catmullrom_basis1 + lVar44 + 0x90c);
    fVar184 = *(float *)(catmullrom_basis1 + lVar44 + 0x910);
    auVar13 = *(undefined1 (*) [12])(catmullrom_basis1 + lVar44 + 0x908);
    fVar246 = *(float *)(catmullrom_basis1 + lVar44 + 0x914);
    fVar187 = *(float *)*(undefined1 (*) [12])(catmullrom_basis1 + lVar44 + 0x484);
    fVar189 = *(float *)(catmullrom_basis1 + lVar44 + 0x488);
    fVar205 = *(float *)(catmullrom_basis1 + lVar44 + 0x48c);
    auVar14 = *(undefined1 (*) [12])(catmullrom_basis1 + lVar44 + 0x484);
    fVar303 = *(float *)(catmullrom_basis1 + lVar44 + 0x490);
    fVar191 = *(float *)(catmullrom_basis1 + lVar44);
    fVar247 = *(float *)(catmullrom_basis1 + lVar44 + 4);
    fVar202 = *(float *)(catmullrom_basis1 + lVar44 + 8);
    fVar260 = *(float *)(catmullrom_basis1 + lVar44 + 0xc);
    fVar170 = fVar251 * fVar191 + fVar241 * fVar187 + fVar245 * fVar150 + fVar201 * fVar169;
    fVar183 = fVar251 * fVar247 + fVar241 * fVar189 + fVar245 * fVar171 + fVar201 * fVar182;
    fVar186 = fVar251 * fVar202 + fVar241 * fVar205 + fVar245 * fVar184 + fVar201 * fVar288;
    fVar188 = fVar251 * fVar260 + fVar241 * fVar303 + fVar245 * fVar246 + fVar201 * fVar289;
    fVar53 = fVar254 * fVar191 + local_3b8 * fVar187 + fVar250 * fVar150 + fVar203 * fVar169;
    fVar84 = fVar254 * fVar247 + local_3b8 * fVar189 + fVar250 * fVar171 + fVar203 * fVar182;
    fVar86 = fVar254 * fVar202 + local_3b8 * fVar205 + fVar250 * fVar184 + fVar203 * fVar288;
    fVar87 = fVar254 * fVar260 + local_3b8 * fVar303 + fVar250 * fVar246 + fVar203 * fVar289;
    auVar196._0_4_ = fVar85 * fVar191 + fVar135 * fVar187 + fVar145 * fVar150 + fVar147 * fVar169;
    auVar196._4_4_ = fVar85 * fVar247 + fVar135 * fVar189 + fVar145 * fVar171 + fVar147 * fVar182;
    auVar196._8_4_ = fVar85 * fVar202 + fVar135 * fVar205 + fVar145 * fVar184 + fVar147 * fVar288;
    auVar196._12_4_ = fVar85 * fVar260 + fVar135 * fVar303 + fVar145 * fVar246 + fVar147 * fVar289;
    fVar205 = fVar170 - fVar151;
    fVar224 = fVar183 - fVar165;
    fVar226 = fVar186 - fVar167;
    fVar227 = fVar188 - fVar168;
    fVar171 = fVar53 - fVar292;
    fVar184 = fVar84 - fVar294;
    fVar187 = fVar86 - fVar297;
    fVar189 = fVar87 - fVar300;
    fVar150 = fVar292 * fVar205 - fVar151 * fVar171;
    fVar295 = fVar294 * fVar224 - fVar165 * fVar184;
    fVar298 = fVar297 * fVar226 - fVar167 * fVar187;
    fVar301 = fVar300 * fVar227 - fVar168 * fVar189;
    auVar54 = maxps(auVar266,auVar196);
    bVar30 = fVar150 * fVar150 <=
             auVar54._0_4_ * auVar54._0_4_ * (fVar205 * fVar205 + fVar171 * fVar171) &&
             0.0 < fVar190;
    bVar31 = fVar295 * fVar295 <=
             auVar54._4_4_ * auVar54._4_4_ * (fVar224 * fVar224 + fVar184 * fVar184) &&
             1.0 < fVar190;
    bVar29 = fVar298 * fVar298 <=
             auVar54._8_4_ * auVar54._8_4_ * (fVar226 * fVar226 + fVar187 * fVar187) &&
             2.0 < fVar190;
    bVar28 = 3.0 < fVar190 &&
             fVar301 * fVar301 <=
             auVar54._12_4_ * auVar54._12_4_ * (fVar227 * fVar227 + fVar189 * fVar189);
    register0x00001544 = auVar281._4_12_;
    local_3c8._0_4_ = auVar281._0_4_ * 4.7683716e-07;
    auVar8._4_4_ = -(uint)bVar31;
    auVar8._0_4_ = -(uint)bVar30;
    auVar8._8_4_ = -(uint)bVar29;
    auVar8._12_4_ = -(uint)bVar28;
    uVar47 = movmskps((int)uVar34,auVar8);
    puVar35 = (undefined1 *)(ulong)uVar47;
    fVar150 = *(float *)(ray + k * 4 + 0x30);
    fStack_3dc = fVar147;
    fStack_3cc = fVar145;
    fStack_3b4 = local_3b8;
    fStack_3b0 = local_3b8;
    fStack_3ac = local_3b8;
    if (uVar47 != 0) {
      local_248 = auVar14._0_4_;
      fStack_244 = auVar14._4_4_;
      fStack_240 = auVar14._8_4_;
      local_528 = auVar13._0_4_;
      fStack_524 = auVar13._4_4_;
      fStack_520 = auVar13._8_4_;
      fVar136 = fVar169 * fVar164 + local_528 * fVar204 + local_248 * fVar244 + fVar191 * fVar256;
      fVar146 = fVar182 * fVar164 + fStack_524 * fVar204 + fStack_244 * fVar244 + fVar247 * fVar256;
      fVar148 = fVar288 * fVar164 + fStack_520 * fVar204 + fStack_240 * fVar244 + fVar202 * fVar256;
      fVar149 = fVar289 * fVar164 + fVar246 * fVar204 + fVar303 * fVar244 + fVar260 * fVar256;
      local_538._0_4_ = auVar12._0_4_;
      local_538._4_4_ = auVar12._4_4_;
      fStack_530 = auVar12._8_4_;
      fVar90 = (float)local_538._0_4_ * fVar164 + fVar236 * fVar204 + fVar223 * fVar244 +
               fVar273 * fVar256;
      fVar128 = (float)local_538._4_4_ * fVar164 + fVar228 * fVar204 + fVar225 * fVar244 +
                fVar276 * fVar256;
      fVar131 = fStack_530 * fVar164 + fVar231 * fVar204 + fVar259 * fVar244 + fVar278 * fVar256;
      fVar133 = fVar185 * fVar164 + fVar233 * fVar204 + fVar270 * fVar244 + fVar287 * fVar256;
      fVar236 = *(float *)(catmullrom_basis0 + lVar44 + 0x1210);
      fVar228 = *(float *)(catmullrom_basis0 + lVar44 + 0x1214);
      fVar231 = *(float *)(catmullrom_basis0 + lVar44 + 0x1218);
      fVar233 = *(float *)(catmullrom_basis0 + lVar44 + 0x121c);
      fVar169 = *(float *)(catmullrom_basis0 + lVar44 + 0x1694);
      fVar182 = *(float *)(catmullrom_basis0 + lVar44 + 0x1698);
      fVar185 = *(float *)(catmullrom_basis0 + lVar44 + 0x169c);
      fVar223 = *(float *)(catmullrom_basis0 + lVar44 + 0x16a0);
      fVar225 = *(float *)(catmullrom_basis0 + lVar44 + 0x1b18);
      fVar259 = *(float *)(catmullrom_basis0 + lVar44 + 0x1b1c);
      fVar270 = *(float *)(catmullrom_basis0 + lVar44 + 0x1b20);
      fVar273 = *(float *)(catmullrom_basis0 + lVar44 + 0x1b24);
      fVar276 = *(float *)(catmullrom_basis0 + lVar44 + 0x1f9c);
      fVar278 = *(float *)(catmullrom_basis0 + lVar44 + 0x1fa0);
      fVar287 = *(float *)(catmullrom_basis0 + lVar44 + 0x1fa4);
      fVar288 = *(float *)(catmullrom_basis0 + lVar44 + 0x1fa8);
      fVar252 = fVar251 * fVar236 + fVar241 * fVar169 + fVar245 * fVar225 + fVar201 * fVar276;
      fVar255 = fVar251 * fVar228 + fVar241 * fVar182 + fVar245 * fVar259 + fVar201 * fVar278;
      fVar257 = fVar251 * fVar231 + fVar241 * fVar185 + fVar245 * fVar270 + fVar201 * fVar287;
      fVar258 = fVar251 * fVar233 + fVar241 * fVar223 + fVar245 * fVar273 + fVar201 * fVar288;
      fVar293 = fVar254 * fVar236 + local_3b8 * fVar169 + fVar250 * fVar225 + fVar203 * fVar276;
      fVar296 = fVar254 * fVar228 + local_3b8 * fVar182 + fVar250 * fVar259 + fVar203 * fVar278;
      fVar299 = fVar254 * fVar231 + local_3b8 * fVar185 + fVar250 * fVar270 + fVar203 * fVar287;
      fVar302 = fVar254 * fVar233 + local_3b8 * fVar223 + fVar250 * fVar273 + fVar203 * fVar288;
      fVar289 = *(float *)(catmullrom_basis1 + lVar44 + 0x1210);
      fVar246 = *(float *)(catmullrom_basis1 + lVar44 + 0x1214);
      fVar303 = *(float *)(catmullrom_basis1 + lVar44 + 0x1218);
      fVar191 = *(float *)(catmullrom_basis1 + lVar44 + 0x121c);
      fVar247 = *(float *)(catmullrom_basis1 + lVar44 + 0x1b18);
      fVar202 = *(float *)(catmullrom_basis1 + lVar44 + 0x1b1c);
      fVar260 = *(float *)(catmullrom_basis1 + lVar44 + 0x1b20);
      fVar295 = *(float *)(catmullrom_basis1 + lVar44 + 0x1b24);
      fVar298 = *(float *)(catmullrom_basis1 + lVar44 + 0x1f9c);
      fVar301 = *(float *)(catmullrom_basis1 + lVar44 + 0x1fa0);
      fVar261 = *(float *)(catmullrom_basis1 + lVar44 + 0x1fa4);
      fVar271 = *(float *)(catmullrom_basis1 + lVar44 + 0x1fa8);
      auVar175._0_4_ = fVar203 * fVar298;
      auVar175._4_4_ = fVar203 * fVar301;
      auVar175._8_4_ = fVar203 * fVar261;
      auVar175._12_4_ = fVar203 * fVar271;
      fVar272 = *(float *)(catmullrom_basis1 + lVar44 + 0x1694);
      fVar274 = *(float *)(catmullrom_basis1 + lVar44 + 0x1698);
      fVar275 = *(float *)(catmullrom_basis1 + lVar44 + 0x169c);
      fVar277 = *(float *)(catmullrom_basis1 + lVar44 + 0x16a0);
      fVar229 = fVar251 * fVar289 + fVar241 * fVar272 + fVar245 * fVar247 + fVar201 * fVar298;
      fVar232 = fVar251 * fVar246 + fVar241 * fVar274 + fVar245 * fVar202 + fVar201 * fVar301;
      fVar234 = fVar251 * fVar303 + fVar241 * fVar275 + fVar245 * fVar260 + fVar201 * fVar261;
      fVar235 = fVar251 * fVar191 + fVar241 * fVar277 + fVar245 * fVar295 + fVar201 * fVar271;
      fVar91 = fVar254 * fVar289 + local_3b8 * fVar272 + fVar250 * fVar247 + auVar175._0_4_;
      fVar129 = fVar254 * fVar246 + local_3b8 * fVar274 + fVar250 * fVar202 + auVar175._4_4_;
      fVar132 = fVar254 * fVar303 + local_3b8 * fVar275 + fVar250 * fVar260 + auVar175._8_4_;
      fVar134 = fVar254 * fVar191 + local_3b8 * fVar277 + fVar250 * fVar295 + auVar175._12_4_;
      auVar267._0_8_ = CONCAT44(fVar255,fVar252) & 0x7fffffff7fffffff;
      auVar267._8_4_ = ABS(fVar257);
      auVar267._12_4_ = ABS(fVar258);
      auVar238._0_8_ = CONCAT44(fVar296,fVar293) & 0x7fffffff7fffffff;
      auVar238._8_4_ = ABS(fVar299);
      auVar238._12_4_ = ABS(fVar302);
      auVar54 = maxps(auVar267,auVar238);
      auVar282._0_8_ =
           CONCAT44(fVar228 * fVar256 + fVar182 * fVar244 + fVar259 * fVar204 + fVar278 * fVar164,
                    fVar236 * fVar256 + fVar169 * fVar244 + fVar225 * fVar204 + fVar276 * fVar164) &
           0x7fffffff7fffffff;
      auVar282._8_4_ =
           ABS(fVar231 * fVar256 + fVar185 * fVar244 + fVar270 * fVar204 + fVar287 * fVar164);
      auVar282._12_4_ =
           ABS(fVar233 * fVar256 + fVar223 * fVar244 + fVar273 * fVar204 + fVar288 * fVar164);
      auVar54 = maxps(auVar54,auVar282);
      uVar48 = -(uint)((float)local_3c8._0_4_ <= auVar54._0_4_);
      uVar50 = -(uint)((float)local_3c8._0_4_ <= auVar54._4_4_);
      uVar49 = -(uint)((float)local_3c8._0_4_ <= auVar54._8_4_);
      uVar51 = -(uint)((float)local_3c8._0_4_ <= auVar54._12_4_);
      fVar182 = (float)((uint)fVar252 & uVar48 | ~uVar48 & (uint)fVar205);
      fVar223 = (float)((uint)fVar255 & uVar50 | ~uVar50 & (uint)fVar224);
      fVar270 = (float)((uint)fVar257 & uVar49 | ~uVar49 & (uint)fVar226);
      fVar273 = (float)((uint)fVar258 & uVar51 | ~uVar51 & (uint)fVar227);
      fVar276 = (float)(~uVar48 & (uint)fVar171 | (uint)fVar293 & uVar48);
      fVar288 = (float)(~uVar50 & (uint)fVar184 | (uint)fVar296 & uVar50);
      fVar252 = (float)(~uVar49 & (uint)fVar187 | (uint)fVar299 & uVar49);
      fVar255 = (float)(~uVar51 & (uint)fVar189 | (uint)fVar302 & uVar51);
      auVar283._0_8_ = CONCAT44(fVar232,fVar229) & 0x7fffffff7fffffff;
      auVar283._8_4_ = ABS(fVar234);
      auVar283._12_4_ = ABS(fVar235);
      auVar243._0_8_ = CONCAT44(fVar129,fVar91) & 0x7fffffff7fffffff;
      auVar243._8_4_ = ABS(fVar132);
      auVar243._12_4_ = ABS(fVar134);
      auVar54 = maxps(auVar283,auVar243);
      auVar220._0_8_ =
           CONCAT44(fVar246 * fVar256 + fVar274 * fVar244 + fVar202 * fVar204 + fVar301 * fVar164,
                    fVar289 * fVar256 + fVar272 * fVar244 + fVar247 * fVar204 + fVar298 * fVar164) &
           0x7fffffff7fffffff;
      auVar220._8_4_ =
           ABS(fVar303 * fVar256 + fVar275 * fVar244 + fVar260 * fVar204 + fVar261 * fVar164);
      auVar220._12_4_ =
           ABS(fVar191 * fVar256 + fVar277 * fVar244 + fVar295 * fVar204 + fVar271 * fVar164);
      auVar54 = maxps(auVar54,auVar220);
      uVar48 = -(uint)((float)local_3c8._0_4_ <= auVar54._0_4_);
      uVar50 = -(uint)((float)local_3c8._0_4_ <= auVar54._4_4_);
      uVar49 = -(uint)((float)local_3c8._0_4_ <= auVar54._8_4_);
      uVar51 = -(uint)((float)local_3c8._0_4_ <= auVar54._12_4_);
      fVar169 = (float)((uint)fVar229 & uVar48 | ~uVar48 & (uint)fVar205);
      fVar185 = (float)((uint)fVar232 & uVar50 | ~uVar50 & (uint)fVar224);
      fVar225 = (float)((uint)fVar234 & uVar49 | ~uVar49 & (uint)fVar226);
      fVar259 = (float)((uint)fVar235 & uVar51 | ~uVar51 & (uint)fVar227);
      fVar289 = (float)(~uVar48 & (uint)fVar171 | (uint)fVar91 & uVar48);
      fVar171 = (float)(~uVar50 & (uint)fVar184 | (uint)fVar129 & uVar50);
      fVar184 = (float)(~uVar49 & (uint)fVar187 | (uint)fVar132 & uVar49);
      fVar246 = (float)(~uVar51 & (uint)fVar189 | (uint)fVar134 & uVar51);
      auVar107._0_4_ = fVar276 * fVar276 + fVar182 * fVar182;
      auVar107._4_4_ = fVar288 * fVar288 + fVar223 * fVar223;
      auVar107._8_4_ = fVar252 * fVar252 + fVar270 * fVar270;
      auVar107._12_4_ = fVar255 * fVar255 + fVar273 * fVar273;
      auVar54 = rsqrtps(auVar175,auVar107);
      fVar236 = auVar54._0_4_;
      fVar228 = auVar54._4_4_;
      fVar231 = auVar54._8_4_;
      fVar233 = auVar54._12_4_;
      auVar176._0_4_ = fVar236 * fVar236 * auVar107._0_4_ * 0.5 * fVar236;
      auVar176._4_4_ = fVar228 * fVar228 * auVar107._4_4_ * 0.5 * fVar228;
      auVar176._8_4_ = fVar231 * fVar231 * auVar107._8_4_ * 0.5 * fVar231;
      auVar176._12_4_ = fVar233 * fVar233 * auVar107._12_4_ * 0.5 * fVar233;
      fVar187 = fVar236 * 1.5 - auVar176._0_4_;
      fVar189 = fVar228 * 1.5 - auVar176._4_4_;
      fVar205 = fVar231 * 1.5 - auVar176._8_4_;
      fVar303 = fVar233 * 1.5 - auVar176._12_4_;
      auVar108._0_4_ = fVar289 * fVar289 + fVar169 * fVar169;
      auVar108._4_4_ = fVar171 * fVar171 + fVar185 * fVar185;
      auVar108._8_4_ = fVar184 * fVar184 + fVar225 * fVar225;
      auVar108._12_4_ = fVar246 * fVar246 + fVar259 * fVar259;
      auVar54 = rsqrtps(auVar176,auVar108);
      fVar236 = auVar54._0_4_;
      fVar228 = auVar54._4_4_;
      fVar231 = auVar54._8_4_;
      fVar233 = auVar54._12_4_;
      fVar236 = fVar236 * 1.5 - fVar236 * fVar236 * auVar108._0_4_ * 0.5 * fVar236;
      fVar278 = fVar228 * 1.5 - fVar228 * fVar228 * auVar108._4_4_ * 0.5 * fVar228;
      fVar231 = fVar231 * 1.5 - fVar231 * fVar231 * auVar108._8_4_ * 0.5 * fVar231;
      fVar287 = fVar233 * 1.5 - fVar233 * fVar233 * auVar108._12_4_ * 0.5 * fVar233;
      fVar260 = fVar276 * fVar187 * auVar266._0_4_;
      fVar271 = fVar288 * fVar189 * auVar266._4_4_;
      fVar274 = fVar252 * fVar205 * auVar266._8_4_;
      fVar277 = fVar255 * fVar303 * auVar266._12_4_;
      fVar228 = -fVar182 * fVar187 * auVar266._0_4_;
      fVar233 = -fVar223 * fVar189 * auVar266._4_4_;
      fVar182 = -fVar270 * fVar205 * auVar266._8_4_;
      fVar223 = -fVar273 * fVar303 * auVar266._12_4_;
      fVar232 = fVar187 * 0.0 * auVar266._0_4_;
      fVar234 = fVar189 * 0.0 * auVar266._4_4_;
      fVar235 = fVar205 * 0.0 * auVar266._8_4_;
      fVar252 = fVar303 * 0.0 * auVar266._12_4_;
      fVar129 = fVar289 * fVar236 * auVar196._0_4_;
      fVar132 = fVar171 * fVar278 * auVar196._4_4_;
      fVar134 = fVar184 * fVar231 * auVar196._8_4_;
      fVar229 = fVar246 * fVar287 * auVar196._12_4_;
      fVar227 = fVar170 + fVar129;
      fVar295 = fVar183 + fVar132;
      fVar298 = fVar186 + fVar134;
      fVar301 = fVar188 + fVar229;
      fVar289 = -fVar169 * fVar236 * auVar196._0_4_;
      fVar184 = -fVar185 * fVar278 * auVar196._4_4_;
      fVar246 = -fVar225 * fVar231 * auVar196._8_4_;
      fVar247 = -fVar259 * fVar287 * auVar196._12_4_;
      fVar225 = fVar53 + fVar289;
      fVar259 = fVar84 + fVar184;
      fVar270 = fVar86 + fVar246;
      fVar273 = fVar87 + fVar247;
      fVar276 = fVar236 * 0.0 * auVar196._0_4_;
      fVar278 = fVar278 * 0.0 * auVar196._4_4_;
      fVar288 = fVar231 * 0.0 * auVar196._8_4_;
      fVar171 = fVar287 * 0.0 * auVar196._12_4_;
      fVar191 = fVar151 - fVar260;
      fVar202 = fVar165 - fVar271;
      fVar224 = fVar167 - fVar274;
      fVar226 = fVar168 - fVar277;
      fVar261 = fVar136 + fVar276;
      fVar272 = fVar146 + fVar278;
      fVar275 = fVar148 + fVar288;
      fVar91 = fVar149 + fVar171;
      fVar236 = fVar292 - fVar228;
      fVar231 = fVar294 - fVar233;
      fVar169 = fVar297 - fVar182;
      fVar185 = fVar300 - fVar223;
      fVar187 = fVar90 - fVar232;
      fVar189 = fVar128 - fVar234;
      fVar205 = fVar131 - fVar235;
      fVar303 = fVar133 - fVar252;
      uVar48 = -(uint)(0.0 < (fVar236 * (fVar261 - fVar187) - fVar187 * (fVar225 - fVar236)) * 0.0 +
                             (fVar187 * (fVar227 - fVar191) - (fVar261 - fVar187) * fVar191) * 0.0 +
                             ((fVar225 - fVar236) * fVar191 - (fVar227 - fVar191) * fVar236));
      uVar50 = -(uint)(0.0 < (fVar231 * (fVar272 - fVar189) - fVar189 * (fVar259 - fVar231)) * 0.0 +
                             (fVar189 * (fVar295 - fVar202) - (fVar272 - fVar189) * fVar202) * 0.0 +
                             ((fVar259 - fVar231) * fVar202 - (fVar295 - fVar202) * fVar231));
      uVar49 = -(uint)(0.0 < (fVar169 * (fVar275 - fVar205) - fVar205 * (fVar270 - fVar169)) * 0.0 +
                             (fVar205 * (fVar298 - fVar224) - (fVar275 - fVar205) * fVar224) * 0.0 +
                             ((fVar270 - fVar169) * fVar224 - (fVar298 - fVar224) * fVar169));
      uVar51 = -(uint)(0.0 < (fVar185 * (fVar91 - fVar303) - fVar303 * (fVar273 - fVar185)) * 0.0 +
                             (fVar303 * (fVar301 - fVar226) - (fVar91 - fVar303) * fVar226) * 0.0 +
                             ((fVar273 - fVar185) * fVar226 - (fVar301 - fVar226) * fVar185));
      fVar151 = (float)((uint)(fVar170 - fVar129) & uVar48 | ~uVar48 & (uint)(fVar151 + fVar260));
      fVar165 = (float)((uint)(fVar183 - fVar132) & uVar50 | ~uVar50 & (uint)(fVar165 + fVar271));
      fVar167 = (float)((uint)(fVar186 - fVar134) & uVar49 | ~uVar49 & (uint)(fVar167 + fVar274));
      fVar168 = (float)((uint)(fVar188 - fVar229) & uVar51 | ~uVar51 & (uint)(fVar168 + fVar277));
      fVar170 = (float)((uint)(fVar53 - fVar289) & uVar48 | ~uVar48 & (uint)(fVar292 + fVar228));
      fVar183 = (float)((uint)(fVar84 - fVar184) & uVar50 | ~uVar50 & (uint)(fVar294 + fVar233));
      fVar186 = (float)((uint)(fVar86 - fVar246) & uVar49 | ~uVar49 & (uint)(fVar297 + fVar182));
      fVar188 = (float)((uint)(fVar87 - fVar247) & uVar51 | ~uVar51 & (uint)(fVar300 + fVar223));
      fVar276 = (float)((uint)(fVar136 - fVar276) & uVar48 | ~uVar48 & (uint)(fVar90 + fVar232));
      fVar287 = (float)((uint)(fVar146 - fVar278) & uVar50 | ~uVar50 & (uint)(fVar128 + fVar234));
      fVar289 = (float)((uint)(fVar148 - fVar288) & uVar49 | ~uVar49 & (uint)(fVar131 + fVar235));
      fVar184 = (float)((uint)(fVar149 - fVar171) & uVar51 | ~uVar51 & (uint)(fVar133 + fVar252));
      fVar247 = (float)((uint)fVar191 & uVar48 | ~uVar48 & (uint)fVar227);
      fVar260 = (float)((uint)fVar202 & uVar50 | ~uVar50 & (uint)fVar295);
      fVar53 = (float)((uint)fVar224 & uVar49 | ~uVar49 & (uint)fVar298);
      fVar84 = (float)((uint)fVar226 & uVar51 | ~uVar51 & (uint)fVar301);
      fVar228 = (float)((uint)fVar236 & uVar48 | ~uVar48 & (uint)fVar225);
      fVar233 = (float)((uint)fVar231 & uVar50 | ~uVar50 & (uint)fVar259);
      fVar182 = (float)((uint)fVar169 & uVar49 | ~uVar49 & (uint)fVar270);
      fVar223 = (float)((uint)fVar185 & uVar51 | ~uVar51 & (uint)fVar273);
      fVar278 = (float)((uint)fVar187 & uVar48 | ~uVar48 & (uint)fVar261);
      fVar288 = (float)((uint)fVar189 & uVar50 | ~uVar50 & (uint)fVar272);
      fVar171 = (float)((uint)fVar205 & uVar49 | ~uVar49 & (uint)fVar275);
      fVar246 = (float)((uint)fVar303 & uVar51 | ~uVar51 & (uint)fVar91);
      fVar191 = (float)((uint)fVar227 & uVar48 | ~uVar48 & (uint)fVar191) - fVar151;
      fVar202 = (float)((uint)fVar295 & uVar50 | ~uVar50 & (uint)fVar202) - fVar165;
      fVar86 = (float)((uint)fVar298 & uVar49 | ~uVar49 & (uint)fVar224) - fVar167;
      fVar87 = (float)((uint)fVar301 & uVar51 | ~uVar51 & (uint)fVar226) - fVar168;
      fVar225 = (float)((uint)fVar225 & uVar48 | ~uVar48 & (uint)fVar236) - fVar170;
      fVar259 = (float)((uint)fVar259 & uVar50 | ~uVar50 & (uint)fVar231) - fVar183;
      fVar270 = (float)((uint)fVar270 & uVar49 | ~uVar49 & (uint)fVar169) - fVar186;
      fVar273 = (float)((uint)fVar273 & uVar51 | ~uVar51 & (uint)fVar185) - fVar188;
      fVar224 = (float)((uint)fVar261 & uVar48 | ~uVar48 & (uint)fVar187) - fVar276;
      fVar226 = (float)((uint)fVar272 & uVar50 | ~uVar50 & (uint)fVar189) - fVar287;
      fVar227 = (float)((uint)fVar275 & uVar49 | ~uVar49 & (uint)fVar205) - fVar289;
      fVar292 = (float)((uint)fVar91 & uVar51 | ~uVar51 & (uint)fVar303) - fVar184;
      fVar300 = fVar151 - fVar247;
      fVar301 = fVar165 - fVar260;
      fVar261 = fVar167 - fVar53;
      fVar271 = fVar168 - fVar84;
      fVar187 = fVar170 - fVar228;
      fVar189 = fVar183 - fVar233;
      fVar205 = fVar186 - fVar182;
      fVar303 = fVar188 - fVar223;
      fVar236 = fVar276 - fVar278;
      fVar231 = fVar287 - fVar288;
      fVar169 = fVar289 - fVar171;
      fVar185 = fVar184 - fVar246;
      fVar294 = (fVar170 * fVar224 - fVar276 * fVar225) * 0.0 +
                (fVar276 * fVar191 - fVar151 * fVar224) * 0.0 +
                (fVar151 * fVar225 - fVar170 * fVar191);
      fVar295 = (fVar183 * fVar226 - fVar287 * fVar259) * 0.0 +
                (fVar287 * fVar202 - fVar165 * fVar226) * 0.0 +
                (fVar165 * fVar259 - fVar183 * fVar202);
      auVar154._4_4_ = fVar295;
      auVar154._0_4_ = fVar294;
      fVar297 = (fVar186 * fVar227 - fVar289 * fVar270) * 0.0 +
                (fVar289 * fVar86 - fVar167 * fVar227) * 0.0 +
                (fVar167 * fVar270 - fVar186 * fVar86);
      fVar298 = (fVar188 * fVar292 - fVar184 * fVar273) * 0.0 +
                (fVar184 * fVar87 - fVar168 * fVar292) * 0.0 +
                (fVar168 * fVar273 - fVar188 * fVar87);
      auVar290._0_4_ =
           (fVar228 * fVar236 - fVar278 * fVar187) * 0.0 +
           (fVar278 * fVar300 - fVar247 * fVar236) * 0.0 + (fVar247 * fVar187 - fVar228 * fVar300);
      auVar290._4_4_ =
           (fVar233 * fVar231 - fVar288 * fVar189) * 0.0 +
           (fVar288 * fVar301 - fVar260 * fVar231) * 0.0 + (fVar260 * fVar189 - fVar233 * fVar301);
      auVar290._8_4_ =
           (fVar182 * fVar169 - fVar171 * fVar205) * 0.0 +
           (fVar171 * fVar261 - fVar53 * fVar169) * 0.0 + (fVar53 * fVar205 - fVar182 * fVar261);
      auVar290._12_4_ =
           (fVar223 * fVar185 - fVar246 * fVar303) * 0.0 +
           (fVar246 * fVar271 - fVar84 * fVar185) * 0.0 + (fVar84 * fVar303 - fVar223 * fVar271);
      auVar154._8_4_ = fVar297;
      auVar154._12_4_ = fVar298;
      auVar54 = maxps(auVar154,auVar290);
      bVar30 = auVar54._0_4_ <= 0.0 && bVar30;
      auVar155._0_4_ = -(uint)bVar30;
      bVar31 = auVar54._4_4_ <= 0.0 && bVar31;
      auVar155._4_4_ = -(uint)bVar31;
      bVar29 = auVar54._8_4_ <= 0.0 && bVar29;
      auVar155._8_4_ = -(uint)bVar29;
      bVar28 = auVar54._12_4_ <= 0.0 && bVar28;
      auVar155._12_4_ = -(uint)bVar28;
      iVar32 = movmskps(uVar47,auVar155);
      if (iVar32 == 0) {
        auVar156._8_8_ = uStack_3f0;
        auVar156._0_8_ = local_3f8;
        iVar32 = 0;
      }
      else {
        auVar177._0_4_ = fVar236 * fVar225;
        auVar177._4_4_ = fVar231 * fVar259;
        auVar177._8_4_ = fVar169 * fVar270;
        auVar177._12_4_ = fVar185 * fVar273;
        fVar278 = fVar187 * fVar224 - auVar177._0_4_;
        fVar288 = fVar189 * fVar226 - auVar177._4_4_;
        fVar171 = fVar205 * fVar227 - auVar177._8_4_;
        fVar246 = fVar303 * fVar292 - auVar177._12_4_;
        fVar236 = fVar236 * fVar191 - fVar224 * fVar300;
        fVar231 = fVar231 * fVar202 - fVar226 * fVar301;
        fVar169 = fVar169 * fVar86 - fVar227 * fVar261;
        fVar185 = fVar185 * fVar87 - fVar292 * fVar271;
        fVar225 = fVar300 * fVar225 - fVar187 * fVar191;
        fVar259 = fVar301 * fVar259 - fVar189 * fVar202;
        fVar270 = fVar261 * fVar270 - fVar205 * fVar86;
        fVar273 = fVar271 * fVar273 - fVar303 * fVar87;
        auVar197._0_4_ = fVar278 * 0.0 + fVar236 * 0.0 + fVar225;
        auVar197._4_4_ = fVar288 * 0.0 + fVar231 * 0.0 + fVar259;
        auVar197._8_4_ = fVar171 * 0.0 + fVar169 * 0.0 + fVar270;
        auVar197._12_4_ = fVar246 * 0.0 + fVar185 * 0.0 + fVar273;
        auVar54 = rcpps(auVar177,auVar197);
        fVar228 = auVar54._0_4_;
        fVar233 = auVar54._4_4_;
        fVar182 = auVar54._8_4_;
        fVar223 = auVar54._12_4_;
        fVar228 = (1.0 - auVar197._0_4_ * fVar228) * fVar228 + fVar228;
        fVar233 = (1.0 - auVar197._4_4_ * fVar233) * fVar233 + fVar233;
        fVar182 = (1.0 - auVar197._8_4_ * fVar182) * fVar182 + fVar182;
        fVar223 = (1.0 - auVar197._12_4_ * fVar223) * fVar223 + fVar223;
        fVar225 = (fVar276 * fVar225 + fVar170 * fVar236 + fVar151 * fVar278) * fVar228;
        fVar231 = (fVar287 * fVar259 + fVar183 * fVar231 + fVar165 * fVar288) * fVar233;
        aVar221.v[1] = fVar231;
        aVar221.v[0] = fVar225;
        fVar169 = (fVar289 * fVar270 + fVar186 * fVar169 + fVar167 * fVar171) * fVar182;
        fVar185 = (fVar184 * fVar273 + fVar188 * fVar185 + fVar168 * fVar246) * fVar223;
        fVar236 = *(float *)(ray + k * 4 + 0x80);
        bVar30 = (fVar225 <= fVar236 && fVar150 <= fVar225) && bVar30;
        auVar73._0_4_ = -(uint)bVar30;
        bVar31 = (fVar231 <= fVar236 && fVar150 <= fVar231) && bVar31;
        auVar73._4_4_ = -(uint)bVar31;
        bVar29 = (fVar169 <= fVar236 && fVar150 <= fVar169) && bVar29;
        auVar73._8_4_ = -(uint)bVar29;
        bVar28 = (fVar185 <= fVar236 && fVar150 <= fVar185) && bVar28;
        auVar73._12_4_ = -(uint)bVar28;
        iVar32 = movmskps(iVar32,auVar73);
        if (iVar32 == 0) {
          auVar156._8_8_ = uStack_3f0;
          auVar156._0_8_ = local_3f8;
          iVar32 = 0;
        }
        else {
          auVar74._0_8_ =
               CONCAT44(-(uint)(auVar197._4_4_ != 0.0 && bVar31),
                        -(uint)(auVar197._0_4_ != 0.0 && bVar30));
          auVar74._8_4_ = -(uint)(auVar197._8_4_ != 0.0 && bVar29);
          auVar74._12_4_ = -(uint)(auVar197._12_4_ != 0.0 && bVar28);
          iVar32 = movmskps(iVar32,auVar74);
          auVar156._8_8_ = uStack_3f0;
          auVar156._0_8_ = local_3f8;
          if (iVar32 != 0) {
            fVar294 = fVar294 * fVar228;
            fVar295 = fVar295 * fVar233;
            fVar297 = fVar297 * fVar182;
            fVar298 = fVar298 * fVar223;
            fVar239 = (float)((uint)(1.0 - fVar294) & uVar48 | ~uVar48 & (uint)fVar294);
            fVar240 = (float)((uint)(1.0 - fVar295) & uVar50 | ~uVar50 & (uint)fVar295);
            fVar248 = (float)((uint)(1.0 - fVar297) & uVar49 | ~uVar49 & (uint)fVar297);
            fVar249 = (float)((uint)(1.0 - fVar298) & uVar51 | ~uVar51 & (uint)fVar298);
            local_258 = (float)(~uVar48 & (uint)(auVar290._0_4_ * fVar228) |
                               (uint)(1.0 - auVar290._0_4_ * fVar228) & uVar48);
            fStack_254 = (float)(~uVar50 & (uint)(auVar290._4_4_ * fVar233) |
                                (uint)(1.0 - auVar290._4_4_ * fVar233) & uVar50);
            fStack_250 = (float)(~uVar49 & (uint)(auVar290._8_4_ * fVar182) |
                                (uint)(1.0 - auVar290._8_4_ * fVar182) & uVar49);
            fStack_24c = (float)(~uVar51 & (uint)(auVar290._12_4_ * fVar223) |
                                (uint)(1.0 - auVar290._12_4_ * fVar223) & uVar51);
            auVar156._8_4_ = auVar74._8_4_;
            auVar156._0_8_ = auVar74._0_8_;
            auVar156._12_4_ = auVar74._12_4_;
            aVar221.v[2] = fVar169;
            aVar221.v[3] = fVar185;
            aVar219 = aVar221;
          }
        }
      }
      uVar47 = movmskps(iVar32,auVar156);
      puVar35 = (undefined1 *)(ulong)uVar47;
      if (uVar47 != 0) {
        fVar228 = (auVar196._0_4_ - auVar266._0_4_) * fVar239 + auVar266._0_4_;
        fVar231 = (auVar196._4_4_ - auVar266._4_4_) * fVar240 + auVar266._4_4_;
        fVar233 = (auVar196._8_4_ - auVar266._8_4_) * fVar248 + auVar266._8_4_;
        fVar169 = (auVar196._12_4_ - auVar266._12_4_) * fVar249 + auVar266._12_4_;
        fVar236 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        fVar182 = aVar219.v[0];
        fVar185 = aVar219.v[1];
        fVar223 = aVar219.v[2];
        fVar225 = aVar219.v[3];
        valid.field_0.i[0] = -(uint)(fVar236 * (fVar228 + fVar228) < fVar182) & auVar156._0_4_;
        valid.field_0.i[1] = -(uint)(fVar236 * (fVar231 + fVar231) < fVar185) & auVar156._4_4_;
        valid.field_0.i[2] = -(uint)(fVar236 * (fVar233 + fVar233) < fVar223) & auVar156._8_4_;
        valid.field_0.i[3] = -(uint)(fVar236 * (fVar169 + fVar169) < fVar225) & auVar156._12_4_;
        uVar47 = movmskps(uVar47,(undefined1  [16])valid.field_0);
        puVar35 = (undefined1 *)(ulong)uVar47;
        if (uVar47 != 0) {
          local_258 = local_258 + local_258 + -1.0;
          fStack_254 = fStack_254 + fStack_254 + -1.0;
          fStack_250 = fStack_250 + fStack_250 + -1.0;
          fStack_24c = fStack_24c + fStack_24c + -1.0;
          bhit.i = 0;
          uVar47 = *(uint *)(ray + k * 4 + 0x90);
          puVar35 = (undefined1 *)(ulong)uVar47;
          if ((pGVar6->mask & uVar47) != 0) {
            fVar236 = 1.0 / fVar190;
            bhit.vu.field_0.v[0] = fVar236 * (fVar239 + 0.0);
            bhit.vu.field_0.v[1] = fVar236 * (fVar240 + 1.0);
            bhit.vu.field_0.v[2] = fVar236 * (fVar248 + 2.0);
            bhit.vu.field_0.v[3] = fVar236 * (fVar249 + 3.0);
            bhit.vv.field_0._0_8_ = CONCAT44(fStack_254,local_258);
            bhit.vv.field_0._8_8_ = CONCAT44(fStack_24c,fStack_250);
            bhit.vt.field_0 = aVar219;
            auVar109._0_4_ = valid.field_0.i[0] & (uint)fVar182;
            auVar109._4_4_ = valid.field_0.i[1] & (uint)fVar185;
            auVar109._8_4_ = valid.field_0.i[2] & (uint)fVar223;
            auVar109._12_4_ = valid.field_0.i[3] & (uint)fVar225;
            auVar138._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
            auVar138._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
            auVar138._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
            auVar138 = auVar138 | auVar109;
            auVar157._4_4_ = auVar138._0_4_;
            auVar157._0_4_ = auVar138._4_4_;
            auVar157._8_4_ = auVar138._12_4_;
            auVar157._12_4_ = auVar138._8_4_;
            auVar54 = minps(auVar157,auVar138);
            auVar110._0_8_ = auVar54._8_8_;
            auVar110._8_4_ = auVar54._0_4_;
            auVar110._12_4_ = auVar54._4_4_;
            auVar54 = minps(auVar110,auVar54);
            auVar111._0_8_ =
                 CONCAT44(-(uint)(auVar54._4_4_ == auVar138._4_4_) & valid.field_0.i[1],
                          -(uint)(auVar54._0_4_ == auVar138._0_4_) & valid.field_0.i[0]);
            auVar111._8_4_ = -(uint)(auVar54._8_4_ == auVar138._8_4_) & valid.field_0.i[2];
            auVar111._12_4_ = -(uint)(auVar54._12_4_ == auVar138._12_4_) & valid.field_0.i[3];
            iVar32 = movmskps(uVar47,auVar111);
            aVar75 = valid.field_0;
            if (iVar32 != 0) {
              aVar75.i[2] = auVar111._8_4_;
              aVar75._0_8_ = auVar111._0_8_;
              aVar75.i[3] = auVar111._12_4_;
            }
            uVar47 = movmskps(iVar32,(undefined1  [16])aVar75);
            lVar45 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
              }
            }
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar236 = bhit.vu.field_0.v[lVar45];
              fVar231 = 1.0 - fVar236;
              fVar228 = fVar236 * 3.0;
              fVar182 = ((fVar228 + 2.0) * (fVar231 + fVar231) + fVar231 * -3.0 * fVar231) * 0.5;
              fVar233 = (fVar231 * -2.0 * fVar236 + fVar236 * fVar236) * 0.5;
              fVar169 = (fVar236 * fVar228 + (fVar228 + -5.0) * (fVar236 + fVar236)) * 0.5;
              fVar228 = bhit.vv.field_0.v[lVar45];
              fVar231 = (fVar236 * (fVar231 + fVar231) - fVar231 * fVar231) * 0.5;
              *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar45];
              *(float *)(ray + k * 4 + 0xc0) =
                   fVar231 * fVar166 + fVar169 * fVar89 + fVar182 * local_3d8 + fVar233 * local_3e8;
              *(float *)(ray + k * 4 + 0xd0) =
                   fVar231 * fVar52 +
                   fVar169 * fVar127 + fVar182 * fStack_3d4 + fVar233 * fStack_3e4;
              *(float *)(ray + k * 4 + 0xe0) =
                   fVar231 * fVar83 +
                   fVar169 * fVar130 + fVar182 * fStack_3d0 + fVar233 * fStack_3e0;
              *(float *)(ray + k * 4 + 0xf0) = fVar236;
              *(float *)(ray + k * 4 + 0x100) = fVar228;
              *(uint *)(ray + k * 4 + 0x110) = (uint)uStack_2e0;
              *(uint *)(ray + k * 4 + 0x120) = uVar46;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar47 = context->user->instPrimID[0];
              puVar35 = (undefined1 *)(ulong)uVar47;
              *(uint *)(ray + k * 4 + 0x140) = uVar47;
              pLVar40 = local_418;
              pre = local_410;
              prim = local_408;
            }
            else {
              local_4f8._4_4_ = uVar46;
              local_4f8._0_4_ = uVar46;
              uStack_4f0._0_4_ = (float)uVar46;
              uStack_4f0._4_4_ = uVar46;
              auVar54 = *(undefined1 (*) [16])(mm_lookupmask_ps + lVar39);
              _local_538 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              bhit.U.field_0.v[0] = fVar239;
              bhit.U.field_0.v[1] = fVar240;
              bhit.U.field_0.v[2] = fVar248;
              bhit.U.field_0.v[3] = fVar249;
              bhit.V.field_0.v[0] = local_258;
              bhit.V.field_0.v[1] = fStack_254;
              bhit.V.field_0.v[2] = fStack_250;
              bhit.V.field_0.v[3] = fStack_24c;
              bhit.T.field_0 = aVar219;
              bhit.N = iVar5;
              bhit.curve3D.v1.field_0.m128[0] = fVar89;
              bhit.curve3D.v1.field_0.m128[1] = fVar127;
              bhit.curve3D.v1.field_0.m128[2] = fVar130;
              bhit.curve3D.v1.field_0.m128[3] = fVar135;
              bhit.valid.field_0 = valid.field_0;
              while( true ) {
                local_d8 = bhit.vu.field_0.v[lVar45];
                local_c8 = bhit.vv.field_0.v[lVar45];
                *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar45];
                fVar169 = 1.0 - local_d8;
                fVar236 = local_d8 * 3.0;
                fVar233 = ((fVar236 + 2.0) * (fVar169 + fVar169) + fVar169 * -3.0 * fVar169) * 0.5;
                fVar228 = (local_d8 * local_d8 + fVar169 * -2.0 * local_d8) * 0.5;
                fVar231 = (local_d8 * fVar236 + (fVar236 + -5.0) * (local_d8 + local_d8)) * 0.5;
                args.context = context->user;
                fVar236 = (local_d8 * (fVar169 + fVar169) - fVar169 * fVar169) * 0.5;
                local_108 = fVar236 * fVar166 +
                            fVar231 * fVar89 + fVar233 * local_3d8 + fVar228 * local_3e8;
                local_f8 = fVar236 * fVar52 +
                           fVar231 * fVar127 + fVar233 * fStack_3d4 + fVar228 * fStack_3e4;
                local_e8 = fVar236 * fVar83 +
                           fVar231 * fVar130 + fVar233 * fStack_3d0 + fVar228 * fStack_3e0;
                fStack_104 = local_108;
                fStack_100 = local_108;
                fStack_fc = local_108;
                fStack_f4 = local_f8;
                fStack_f0 = local_f8;
                fStack_ec = local_f8;
                fStack_e4 = local_e8;
                fStack_e0 = local_e8;
                fStack_dc = local_e8;
                fStack_d4 = local_d8;
                fStack_d0 = local_d8;
                fStack_cc = local_d8;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                local_b8 = CONCAT44((uint)uStack_2e0,(uint)uStack_2e0);
                uStack_b0 = CONCAT44((uint)uStack_2e0,(uint)uStack_2e0);
                local_a8 = local_4f8;
                uStack_a0 = uStack_4f0;
                local_98 = (args.context)->instID[0];
                uStack_94 = local_98;
                uStack_90 = local_98;
                uStack_8c = local_98;
                local_88 = (args.context)->instPrimID[0];
                uStack_84 = local_88;
                uStack_80 = local_88;
                uStack_7c = local_88;
                args.valid = (int *)local_428;
                args.geometryUserPtr = pGVar6->userPtr;
                args.hit = (RTCHitN *)&local_108;
                args.N = 4;
                p_Var36 = pGVar6->intersectionFilterN;
                local_428 = auVar54;
                args.ray = (RTCRayN *)ray;
                if (p_Var36 != (RTCFilterFunctionN)0x0) {
                  p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&args);
                }
                auVar121._0_4_ = -(uint)(local_428._0_4_ == 0);
                auVar121._4_4_ = -(uint)(local_428._4_4_ == 0);
                auVar121._8_4_ = -(uint)(local_428._8_4_ == 0);
                auVar121._12_4_ = -(uint)(local_428._12_4_ == 0);
                uVar47 = movmskps((int)p_Var36,auVar121);
                pRVar37 = (RTCRayN *)(ulong)(uVar47 ^ 0xf);
                if ((uVar47 ^ 0xf) == 0) {
                  auVar121 = auVar121 ^ _DAT_01f46b70;
                }
                else {
                  p_Var36 = context->args->filter;
                  if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&args);
                  }
                  auVar80._0_4_ = -(uint)(local_428._0_4_ == 0);
                  auVar80._4_4_ = -(uint)(local_428._4_4_ == 0);
                  auVar80._8_4_ = -(uint)(local_428._8_4_ == 0);
                  auVar80._12_4_ = -(uint)(local_428._12_4_ == 0);
                  auVar121 = auVar80 ^ _DAT_01f46b70;
                  uVar47 = movmskps((int)p_Var36,auVar80);
                  pRVar37 = (RTCRayN *)(ulong)(uVar47 ^ 0xf);
                  if ((uVar47 ^ 0xf) != 0) {
                    uVar47 = *(uint *)(args.hit + 4);
                    uVar48 = *(uint *)(args.hit + 8);
                    uVar50 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar80._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar80._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar80._4_4_ & uVar47 | *(uint *)(args.ray + 0xc4) & auVar80._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar80._8_4_ & uVar48 | *(uint *)(args.ray + 200) & auVar80._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar80._12_4_ & uVar50 | *(uint *)(args.ray + 0xcc) & auVar80._12_4_;
                    uVar47 = *(uint *)(args.hit + 0x14);
                    uVar48 = *(uint *)(args.hit + 0x18);
                    uVar50 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar80._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar80._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar80._4_4_ & uVar47 | *(uint *)(args.ray + 0xd4) & auVar80._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar80._8_4_ & uVar48 | *(uint *)(args.ray + 0xd8) & auVar80._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar80._12_4_ & uVar50 | *(uint *)(args.ray + 0xdc) & auVar80._12_4_;
                    uVar47 = *(uint *)(args.hit + 0x24);
                    uVar48 = *(uint *)(args.hit + 0x28);
                    uVar50 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~auVar80._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & auVar80._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~auVar80._4_4_ & uVar47 | *(uint *)(args.ray + 0xe4) & auVar80._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~auVar80._8_4_ & uVar48 | *(uint *)(args.ray + 0xe8) & auVar80._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~auVar80._12_4_ & uVar50 | *(uint *)(args.ray + 0xec) & auVar80._12_4_;
                    uVar47 = *(uint *)(args.hit + 0x34);
                    uVar48 = *(uint *)(args.hit + 0x38);
                    uVar50 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~auVar80._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & auVar80._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~auVar80._4_4_ & uVar47 | *(uint *)(args.ray + 0xf4) & auVar80._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~auVar80._8_4_ & uVar48 | *(uint *)(args.ray + 0xf8) & auVar80._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~auVar80._12_4_ & uVar50 | *(uint *)(args.ray + 0xfc) & auVar80._12_4_;
                    uVar47 = *(uint *)(args.hit + 0x44);
                    uVar48 = *(uint *)(args.hit + 0x48);
                    uVar50 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar80._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar80._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar80._4_4_ & uVar47 | *(uint *)(args.ray + 0x104) & auVar80._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar80._8_4_ & uVar48 | *(uint *)(args.ray + 0x108) & auVar80._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar80._12_4_ & uVar50 | *(uint *)(args.ray + 0x10c) & auVar80._12_4_;
                    uVar47 = *(uint *)(args.hit + 0x54);
                    uVar48 = *(uint *)(args.hit + 0x58);
                    uVar50 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar80._0_4_ |
                         ~auVar80._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar80._4_4_ | ~auVar80._4_4_ & uVar47;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar80._8_4_ | ~auVar80._8_4_ & uVar48;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar80._12_4_ | ~auVar80._12_4_ & uVar50;
                    uVar47 = *(uint *)(args.hit + 100);
                    uVar48 = *(uint *)(args.hit + 0x68);
                    uVar50 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar80._0_4_ |
                         ~auVar80._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar80._4_4_ | ~auVar80._4_4_ & uVar47;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar80._8_4_ | ~auVar80._8_4_ & uVar48;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar80._12_4_ | ~auVar80._12_4_ & uVar50;
                    uVar47 = *(uint *)(args.hit + 0x74);
                    uVar48 = *(uint *)(args.hit + 0x78);
                    uVar50 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar80._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar80._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar80._4_4_ & uVar47 | *(uint *)(args.ray + 0x134) & auVar80._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar80._8_4_ & uVar48 | *(uint *)(args.ray + 0x138) & auVar80._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar80._12_4_ & uVar50 | *(uint *)(args.ray + 0x13c) & auVar80._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar80 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar80;
                    pRVar37 = args.ray;
                  }
                }
                auVar122._0_4_ = auVar121._0_4_ << 0x1f;
                auVar122._4_4_ = auVar121._4_4_ << 0x1f;
                auVar122._8_4_ = auVar121._8_4_ << 0x1f;
                auVar122._12_4_ = auVar121._12_4_ << 0x1f;
                uVar38 = (undefined4)((ulong)pRVar37 >> 0x20);
                iVar32 = movmskps((int)pRVar37,auVar122);
                if (iVar32 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_538._0_4_;
                }
                else {
                  local_538._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_538._4_4_ = 0;
                  fStack_530 = 0.0;
                  uStack_52c = 0;
                }
                *(undefined4 *)(local_428 + lVar45 * 4 + -0x10) = 0;
                valid.field_0.i[0] = -(uint)(fVar182 <= (float)local_538._0_4_) & valid.field_0.i[0]
                ;
                valid.field_0.i[1] = -(uint)(fVar185 <= (float)local_538._0_4_) & valid.field_0.i[1]
                ;
                valid.field_0.i[2] = -(uint)(fVar223 <= (float)local_538._0_4_) & valid.field_0.i[2]
                ;
                valid.field_0.i[3] = -(uint)(fVar225 <= (float)local_538._0_4_) & valid.field_0.i[3]
                ;
                iVar32 = movmskps(iVar32,(undefined1  [16])valid.field_0);
                puVar35 = (undefined1 *)CONCAT44(uVar38,iVar32);
                pLVar40 = local_418;
                pre = local_410;
                prim = local_408;
                if (iVar32 == 0) break;
                auVar123._0_4_ = valid.field_0.i[0] & (uint)fVar182;
                auVar123._4_4_ = valid.field_0.i[1] & (uint)fVar185;
                auVar123._8_4_ = valid.field_0.i[2] & (uint)fVar223;
                auVar123._12_4_ = valid.field_0.i[3] & (uint)fVar225;
                auVar144._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar144._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar144._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar144 = auVar144 | auVar123;
                auVar163._4_4_ = auVar144._0_4_;
                auVar163._0_4_ = auVar144._4_4_;
                auVar163._8_4_ = auVar144._12_4_;
                auVar163._12_4_ = auVar144._8_4_;
                auVar194 = minps(auVar163,auVar144);
                auVar124._0_8_ = auVar194._8_8_;
                auVar124._8_4_ = auVar194._0_4_;
                auVar124._12_4_ = auVar194._4_4_;
                auVar194 = minps(auVar124,auVar194);
                auVar125._0_8_ =
                     CONCAT44(-(uint)(auVar194._4_4_ == auVar144._4_4_) & valid.field_0.i[1],
                              -(uint)(auVar194._0_4_ == auVar144._0_4_) & valid.field_0.i[0]);
                auVar125._8_4_ = -(uint)(auVar194._8_4_ == auVar144._8_4_) & valid.field_0.i[2];
                auVar125._12_4_ = -(uint)(auVar194._12_4_ == auVar144._12_4_) & valid.field_0.i[3];
                iVar32 = movmskps(iVar32,auVar125);
                aVar81 = valid.field_0;
                if (iVar32 != 0) {
                  aVar81.i[2] = auVar125._8_4_;
                  aVar81._0_8_ = auVar125._0_8_;
                  aVar81.i[3] = auVar125._12_4_;
                }
                uVar33 = movmskps(iVar32,(undefined1  [16])aVar81);
                uVar34 = CONCAT44(uVar38,uVar33);
                lVar45 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar38 = SUB84(puVar35,0);
    if (4 < iVar5) {
      local_58 = iVar5;
      iStack_54 = iVar5;
      iStack_50 = iVar5;
      iStack_4c = iVar5;
      local_78 = 1.0 / fVar190;
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      local_68 = uVar46;
      uStack_64 = uVar46;
      uStack_60 = uVar46;
      uStack_5c = uVar46;
      local_2e8 = CONCAT44((uint)uStack_2e0,(uint)uStack_2e0);
      uStack_2e0._4_4_ = (uint)uStack_2e0;
      local_3c8._4_4_ = local_3c8._0_4_;
      fStack_3c0 = (float)local_3c8._0_4_;
      fStack_3bc = (float)local_3c8._0_4_;
      for (lVar45 = 4; uVar38 = SUB84(puVar35,0), lVar45 < iVar5; lVar45 = lVar45 + 4) {
        bhit.i = (int)lVar45;
        pfVar1 = (float *)(catmullrom_basis0 + lVar45 * 4 + lVar44);
        fVar190 = *pfVar1;
        fVar236 = pfVar1[1];
        fVar228 = pfVar1[2];
        fVar231 = pfVar1[3];
        pfVar1 = (float *)(lVar44 + 0x22047f0 + lVar45 * 4);
        fVar233 = *pfVar1;
        fVar169 = pfVar1[1];
        fVar182 = pfVar1[2];
        fVar185 = pfVar1[3];
        pfVar1 = (float *)(lVar44 + 0x2204c74 + lVar45 * 4);
        fVar223 = *pfVar1;
        fVar225 = pfVar1[1];
        fVar259 = pfVar1[2];
        fVar270 = pfVar1[3];
        pfVar1 = (float *)(lVar44 + 0x22050f8 + lVar45 * 4);
        fVar273 = *pfVar1;
        fVar276 = pfVar1[1];
        fVar278 = pfVar1[2];
        fVar287 = pfVar1[3];
        fVar170 = fVar251 * fVar190 + fVar241 * fVar233 + fVar245 * fVar223 + fVar201 * fVar273;
        fVar183 = fVar251 * fVar236 + fVar241 * fVar169 + fVar245 * fVar225 + fVar201 * fVar276;
        fVar186 = fVar251 * fVar228 + fVar241 * fVar182 + fVar245 * fVar259 + fVar201 * fVar278;
        fVar188 = fVar251 * fVar231 + fVar241 * fVar185 + fVar245 * fVar270 + fVar201 * fVar287;
        fVar300 = fVar254 * fVar190 + local_3b8 * fVar233 + fVar250 * fVar223 + fVar203 * fVar273;
        fVar261 = fVar254 * fVar236 + fStack_3b4 * fVar169 + fVar250 * fVar225 + fVar203 * fVar276;
        fVar272 = fVar254 * fVar228 + fStack_3b0 * fVar182 + fVar250 * fVar259 + fVar203 * fVar278;
        fVar275 = fVar254 * fVar231 + fStack_3ac * fVar185 + fVar250 * fVar270 + fVar203 * fVar287;
        auVar158._0_4_ =
             fVar85 * fVar190 + fVar135 * fVar233 + fVar145 * fVar223 + fVar147 * fVar273;
        auVar158._4_4_ =
             fVar85 * fVar236 + fVar135 * fVar169 + fVar145 * fVar225 + fVar147 * fVar276;
        auVar158._8_4_ =
             fVar85 * fVar228 + fVar135 * fVar182 + fVar145 * fVar259 + fVar147 * fVar278;
        auVar158._12_4_ =
             fVar85 * fVar231 + fVar135 * fVar185 + fVar145 * fVar270 + fVar147 * fVar287;
        puVar35 = catmullrom_basis1 + lVar44;
        pfVar1 = (float *)(puVar35 + lVar45 * 4);
        fVar288 = *pfVar1;
        fVar289 = pfVar1[1];
        fVar171 = pfVar1[2];
        fVar184 = pfVar1[3];
        pfVar1 = (float *)(lVar44 + 0x2206c10 + lVar45 * 4);
        fVar246 = *pfVar1;
        fVar187 = pfVar1[1];
        fVar189 = pfVar1[2];
        fVar205 = pfVar1[3];
        pfVar1 = (float *)(lVar44 + 0x2207094 + lVar45 * 4);
        fVar303 = *pfVar1;
        fVar191 = pfVar1[1];
        fVar247 = pfVar1[2];
        fVar202 = pfVar1[3];
        pauVar3 = (undefined1 (*) [12])(lVar44 + 0x2207518 + lVar45 * 4);
        fVar260 = *(float *)*pauVar3;
        fVar53 = *(float *)(*pauVar3 + 4);
        fVar84 = *(float *)(*pauVar3 + 8);
        auVar12 = *pauVar3;
        fVar86 = *(float *)pauVar3[1];
        fVar151 = fVar251 * fVar288 + fVar241 * fVar246 + fVar245 * fVar303 + fVar201 * fVar260;
        fVar165 = fVar251 * fVar289 + fVar241 * fVar187 + fVar245 * fVar191 + fVar201 * fVar53;
        fVar167 = fVar251 * fVar171 + fVar241 * fVar189 + fVar245 * fVar247 + fVar201 * fVar84;
        fVar168 = fVar251 * fVar184 + fVar241 * fVar205 + fVar245 * fVar202 + fVar201 * fVar86;
        fVar294 = fVar254 * fVar288 + local_3b8 * fVar246 + fVar250 * fVar303 + fVar203 * fVar260;
        fVar295 = fVar254 * fVar289 + fStack_3b4 * fVar187 + fVar250 * fVar191 + fVar203 * fVar53;
        fVar297 = fVar254 * fVar171 + fStack_3b0 * fVar189 + fVar250 * fVar247 + fVar203 * fVar84;
        fVar298 = fVar254 * fVar184 + fStack_3ac * fVar205 + fVar250 * fVar202 + fVar203 * fVar86;
        auVar284._0_4_ =
             fVar85 * fVar288 + fVar135 * fVar246 + fVar145 * fVar303 + fVar147 * fVar260;
        auVar284._4_4_ = fVar85 * fVar289 + fVar135 * fVar187 + fVar145 * fVar191 + fVar147 * fVar53
        ;
        auVar284._8_4_ = fVar85 * fVar171 + fVar135 * fVar189 + fVar145 * fVar247 + fVar147 * fVar84
        ;
        auVar284._12_4_ =
             fVar85 * fVar184 + fVar135 * fVar205 + fVar145 * fVar202 + fVar147 * fVar86;
        fVar260 = fVar151 - fVar170;
        fVar53 = fVar165 - fVar183;
        fVar84 = fVar167 - fVar186;
        fVar87 = fVar168 - fVar188;
        fVar224 = fVar294 - fVar300;
        fVar226 = fVar295 - fVar261;
        fVar227 = fVar297 - fVar272;
        fVar292 = fVar298 - fVar275;
        fVar301 = fVar300 * fVar260 - fVar170 * fVar224;
        fVar271 = fVar261 * fVar53 - fVar183 * fVar226;
        fVar274 = fVar272 * fVar84 - fVar186 * fVar227;
        fVar277 = fVar275 * fVar87 - fVar188 * fVar292;
        auVar54 = maxps(auVar158,auVar284);
        bVar30 = fVar301 * fVar301 <=
                 auVar54._0_4_ * auVar54._0_4_ * (fVar260 * fVar260 + fVar224 * fVar224) &&
                 bhit.i < local_58;
        auVar268._0_4_ = -(uint)bVar30;
        bVar31 = fVar271 * fVar271 <=
                 auVar54._4_4_ * auVar54._4_4_ * (fVar53 * fVar53 + fVar226 * fVar226) &&
                 (int)(bhit.i | 1U) < iStack_54;
        auVar268._4_4_ = -(uint)bVar31;
        bVar29 = fVar274 * fVar274 <=
                 auVar54._8_4_ * auVar54._8_4_ * (fVar84 * fVar84 + fVar227 * fVar227) &&
                 (int)(bhit.i | 2U) < iStack_50;
        auVar268._8_4_ = -(uint)bVar29;
        bVar28 = fVar277 * fVar277 <=
                 auVar54._12_4_ * auVar54._12_4_ * (fVar87 * fVar87 + fVar292 * fVar292) &&
                 (int)(bhit.i | 3U) < iStack_4c;
        auVar268._12_4_ = -(uint)bVar28;
        iVar32 = movmskps(iVar5,auVar268);
        if (iVar32 != 0) {
          local_4f8._0_4_ = auVar12._0_4_;
          local_4f8._4_4_ = auVar12._4_4_;
          uStack_4f0._0_4_ = auVar12._8_4_;
          fVar129 = (float)local_4f8._0_4_ * fVar164 + fVar303 * fVar204 + fVar246 * fVar244 +
                    fVar288 * fVar256;
          fVar131 = (float)local_4f8._4_4_ * fVar164 + fVar191 * fVar204 + fVar187 * fVar244 +
                    fVar289 * fVar256;
          fVar132 = (float)uStack_4f0 * fVar164 + fVar247 * fVar204 + fVar189 * fVar244 +
                    fVar171 * fVar256;
          fVar133 = fVar86 * fVar164 + fVar202 * fVar204 + fVar205 * fVar244 + fVar184 * fVar256;
          fVar134 = fVar273 * fVar164 + fVar223 * fVar204 + fVar233 * fVar244 + fVar190 * fVar256;
          fVar136 = fVar276 * fVar164 + fVar225 * fVar204 + fVar169 * fVar244 + fVar236 * fVar256;
          fVar146 = fVar278 * fVar164 + fVar259 * fVar204 + fVar182 * fVar244 + fVar228 * fVar256;
          fVar148 = fVar287 * fVar164 + fVar270 * fVar204 + fVar185 * fVar244 + fVar231 * fVar256;
          pfVar1 = (float *)(lVar44 + 0x220557c + lVar45 * 4);
          fVar190 = *pfVar1;
          fVar236 = pfVar1[1];
          fVar228 = pfVar1[2];
          fVar231 = pfVar1[3];
          pfVar1 = (float *)(lVar44 + 0x2205a00 + lVar45 * 4);
          fVar233 = *pfVar1;
          fVar169 = pfVar1[1];
          fVar182 = pfVar1[2];
          fVar185 = pfVar1[3];
          pfVar1 = (float *)(lVar44 + 0x2205e84 + lVar45 * 4);
          fVar223 = *pfVar1;
          fVar225 = pfVar1[1];
          fVar259 = pfVar1[2];
          fVar270 = pfVar1[3];
          pfVar1 = (float *)(lVar44 + 0x2206308 + lVar45 * 4);
          fVar273 = *pfVar1;
          fVar276 = pfVar1[1];
          fVar278 = pfVar1[2];
          fVar287 = pfVar1[3];
          fVar149 = fVar251 * fVar190 + fVar241 * fVar233 + fVar245 * fVar223 + fVar201 * fVar273;
          fVar229 = fVar251 * fVar236 + fVar241 * fVar169 + fVar245 * fVar225 + fVar201 * fVar276;
          fVar232 = fVar251 * fVar228 + fVar241 * fVar182 + fVar245 * fVar259 + fVar201 * fVar278;
          fVar234 = fVar251 * fVar231 + fVar241 * fVar185 + fVar245 * fVar270 + fVar201 * fVar287;
          fVar277 = fVar254 * fVar190 + local_3b8 * fVar233 + fVar250 * fVar223 + fVar203 * fVar273;
          fVar90 = fVar254 * fVar236 + fStack_3b4 * fVar169 + fVar250 * fVar225 + fVar203 * fVar276;
          fVar91 = fVar254 * fVar228 + fStack_3b0 * fVar182 + fVar250 * fVar259 + fVar203 * fVar278;
          fVar128 = fVar254 * fVar231 + fStack_3ac * fVar185 + fVar250 * fVar270 + fVar203 * fVar287
          ;
          pfVar1 = (float *)(lVar44 + 0x220799c + lVar45 * 4);
          fVar288 = *pfVar1;
          fVar289 = pfVar1[1];
          fVar171 = pfVar1[2];
          fVar184 = pfVar1[3];
          pfVar1 = (float *)(lVar44 + 0x22082a4 + lVar45 * 4);
          fVar246 = *pfVar1;
          fVar187 = pfVar1[1];
          fVar189 = pfVar1[2];
          fVar205 = pfVar1[3];
          pfVar1 = (float *)(lVar44 + 0x2208728 + lVar45 * 4);
          fVar303 = *pfVar1;
          fVar191 = pfVar1[1];
          fVar247 = pfVar1[2];
          fVar202 = pfVar1[3];
          pfVar1 = (float *)(lVar44 + 0x2207e20 + lVar45 * 4);
          fVar86 = *pfVar1;
          fVar301 = pfVar1[1];
          fVar271 = pfVar1[2];
          fVar274 = pfVar1[3];
          fVar235 = fVar251 * fVar288 + fVar241 * fVar86 + fVar245 * fVar246 + fVar201 * fVar303;
          fVar252 = fVar251 * fVar289 + fVar241 * fVar301 + fVar245 * fVar187 + fVar201 * fVar191;
          fVar255 = fVar251 * fVar171 + fVar241 * fVar271 + fVar245 * fVar189 + fVar201 * fVar247;
          fVar257 = fVar251 * fVar184 + fVar241 * fVar274 + fVar245 * fVar205 + fVar201 * fVar202;
          fVar258 = fVar254 * fVar288 + local_3b8 * fVar86 + fVar250 * fVar246 + fVar203 * fVar303;
          fVar293 = fVar254 * fVar289 + fStack_3b4 * fVar301 + fVar250 * fVar187 + fVar203 * fVar191
          ;
          fVar296 = fVar254 * fVar171 + fStack_3b0 * fVar271 + fVar250 * fVar189 + fVar203 * fVar247
          ;
          fVar299 = fVar254 * fVar184 + fStack_3ac * fVar274 + fVar250 * fVar205 + fVar203 * fVar202
          ;
          auVar269._0_8_ = CONCAT44(fVar229,fVar149) & 0x7fffffff7fffffff;
          auVar269._8_4_ = ABS(fVar232);
          auVar269._12_4_ = ABS(fVar234);
          auVar198._0_8_ = CONCAT44(fVar90,fVar277) & 0x7fffffff7fffffff;
          auVar198._8_4_ = ABS(fVar91);
          auVar198._12_4_ = ABS(fVar128);
          auVar54 = maxps(auVar269,auVar198);
          auVar285._0_8_ =
               CONCAT44(fVar236 * fVar256 +
                        fVar169 * fVar244 + fVar225 * fVar204 + fVar276 * fVar164,
                        fVar190 * fVar256 +
                        fVar233 * fVar244 + fVar223 * fVar204 + fVar273 * fVar164) &
               0x7fffffff7fffffff;
          auVar285._8_4_ =
               ABS(fVar228 * fVar256 + fVar182 * fVar244 + fVar259 * fVar204 + fVar278 * fVar164);
          auVar285._12_4_ =
               ABS(fVar231 * fVar256 + fVar185 * fVar244 + fVar270 * fVar204 + fVar287 * fVar164);
          auVar54 = maxps(auVar54,auVar285);
          uVar47 = -(uint)((float)local_3c8._0_4_ <= auVar54._0_4_);
          uVar48 = -(uint)((float)local_3c8._4_4_ <= auVar54._4_4_);
          uVar50 = -(uint)(fStack_3c0 <= auVar54._8_4_);
          uVar49 = -(uint)(fStack_3bc <= auVar54._12_4_);
          auVar199._0_4_ = ~uVar47 & (uint)fVar260;
          auVar199._4_4_ = ~uVar48 & (uint)fVar53;
          auVar199._8_4_ = ~uVar50 & (uint)fVar84;
          auVar199._12_4_ = ~uVar49 & (uint)fVar87;
          auVar253._0_4_ = (uint)fVar149 & uVar47;
          auVar253._4_4_ = (uint)fVar229 & uVar48;
          auVar253._8_4_ = (uint)fVar232 & uVar50;
          auVar253._12_4_ = (uint)fVar234 & uVar49;
          auVar253 = auVar253 | auVar199;
          fVar225 = (float)(~uVar47 & (uint)fVar224 | (uint)fVar277 & uVar47);
          fVar270 = (float)(~uVar48 & (uint)fVar226 | (uint)fVar90 & uVar48);
          fVar277 = (float)(~uVar50 & (uint)fVar227 | (uint)fVar91 & uVar50);
          fVar90 = (float)(~uVar49 & (uint)fVar292 | (uint)fVar128 & uVar49);
          auVar286._0_8_ = CONCAT44(fVar252,fVar235) & 0x7fffffff7fffffff;
          auVar286._8_4_ = ABS(fVar255);
          auVar286._12_4_ = ABS(fVar257);
          auVar139._0_8_ = CONCAT44(fVar293,fVar258) & 0x7fffffff7fffffff;
          auVar139._8_4_ = ABS(fVar296);
          auVar139._12_4_ = ABS(fVar299);
          auVar54 = maxps(auVar286,auVar139);
          auVar76._0_8_ =
               CONCAT44(fVar289 * fVar256 +
                        fVar301 * fVar244 + fVar187 * fVar204 + fVar191 * fVar164,
                        fVar288 * fVar256 + fVar86 * fVar244 + fVar246 * fVar204 + fVar303 * fVar164
                       ) & 0x7fffffff7fffffff;
          auVar76._8_4_ =
               ABS(fVar171 * fVar256 + fVar271 * fVar244 + fVar189 * fVar204 + fVar247 * fVar164);
          auVar76._12_4_ =
               ABS(fVar184 * fVar256 + fVar274 * fVar244 + fVar205 * fVar204 + fVar202 * fVar164);
          auVar54 = maxps(auVar54,auVar76);
          uVar47 = -(uint)((float)local_3c8._0_4_ <= auVar54._0_4_);
          uVar48 = -(uint)((float)local_3c8._4_4_ <= auVar54._4_4_);
          uVar50 = -(uint)(fStack_3c0 <= auVar54._8_4_);
          uVar49 = -(uint)(fStack_3bc <= auVar54._12_4_);
          fVar303 = (float)((uint)fVar235 & uVar47 | ~uVar47 & (uint)fVar260);
          fVar247 = (float)((uint)fVar252 & uVar48 | ~uVar48 & (uint)fVar53);
          fVar260 = (float)((uint)fVar255 & uVar50 | ~uVar50 & (uint)fVar84);
          fVar84 = (float)((uint)fVar257 & uVar49 | ~uVar49 & (uint)fVar87);
          fVar288 = (float)(~uVar47 & (uint)fVar224 | (uint)fVar258 & uVar47);
          fVar171 = (float)(~uVar48 & (uint)fVar226 | (uint)fVar293 & uVar48);
          fVar246 = (float)(~uVar50 & (uint)fVar227 | (uint)fVar296 & uVar50);
          fVar189 = (float)(~uVar49 & (uint)fVar292 | (uint)fVar299 & uVar49);
          fVar185 = auVar253._0_4_;
          fVar190 = auVar253._4_4_;
          fVar236 = auVar253._8_4_;
          fVar228 = auVar253._12_4_;
          auVar178._0_4_ = fVar225 * fVar225 + fVar185 * fVar185;
          auVar178._4_4_ = fVar270 * fVar270 + fVar190 * fVar190;
          auVar178._8_4_ = fVar277 * fVar277 + fVar236 * fVar236;
          auVar178._12_4_ = fVar90 * fVar90 + fVar228 * fVar228;
          auVar54 = rsqrtps(auVar199,auVar178);
          fVar231 = auVar54._0_4_;
          fVar233 = auVar54._4_4_;
          fVar169 = auVar54._8_4_;
          fVar182 = auVar54._12_4_;
          auVar200._0_4_ = fVar231 * fVar231 * auVar178._0_4_ * 0.5 * fVar231;
          auVar200._4_4_ = fVar233 * fVar233 * auVar178._4_4_ * 0.5 * fVar233;
          auVar200._8_4_ = fVar169 * fVar169 * auVar178._8_4_ * 0.5 * fVar169;
          auVar200._12_4_ = fVar182 * fVar182 * auVar178._12_4_ * 0.5 * fVar182;
          fVar273 = fVar231 * 1.5 - auVar200._0_4_;
          fVar276 = fVar233 * 1.5 - auVar200._4_4_;
          fVar278 = fVar169 * 1.5 - auVar200._8_4_;
          fVar287 = fVar182 * 1.5 - auVar200._12_4_;
          auVar179._0_4_ = fVar288 * fVar288 + fVar303 * fVar303;
          auVar179._4_4_ = fVar171 * fVar171 + fVar247 * fVar247;
          auVar179._8_4_ = fVar246 * fVar246 + fVar260 * fVar260;
          auVar179._12_4_ = fVar189 * fVar189 + fVar84 * fVar84;
          auVar54 = rsqrtps(auVar200,auVar179);
          fVar231 = auVar54._0_4_;
          fVar233 = auVar54._4_4_;
          fVar169 = auVar54._8_4_;
          fVar182 = auVar54._12_4_;
          fVar223 = fVar231 * 1.5 - fVar231 * fVar231 * auVar179._0_4_ * 0.5 * fVar231;
          fVar233 = fVar233 * 1.5 - fVar233 * fVar233 * auVar179._4_4_ * 0.5 * fVar233;
          fVar259 = fVar169 * 1.5 - fVar169 * fVar169 * auVar179._8_4_ * 0.5 * fVar169;
          fVar182 = fVar182 * 1.5 - fVar182 * fVar182 * auVar179._12_4_ * 0.5 * fVar182;
          fVar191 = fVar225 * fVar273 * auVar158._0_4_;
          fVar202 = fVar270 * fVar276 * auVar158._4_4_;
          fVar53 = fVar277 * fVar278 * auVar158._8_4_;
          fVar86 = fVar90 * fVar287 * auVar158._12_4_;
          fVar169 = -fVar185 * fVar273 * auVar158._0_4_;
          fVar185 = -fVar190 * fVar276 * auVar158._4_4_;
          fVar225 = -fVar236 * fVar278 * auVar158._8_4_;
          fVar270 = -fVar228 * fVar287 * auVar158._12_4_;
          fVar289 = fVar273 * 0.0 * auVar158._0_4_;
          fVar184 = fVar276 * 0.0 * auVar158._4_4_;
          fVar187 = fVar278 * 0.0 * auVar158._8_4_;
          fVar205 = fVar287 * 0.0 * auVar158._12_4_;
          fVar87 = fVar288 * fVar223 * auVar284._0_4_;
          fVar229 = fVar171 * fVar233 * auVar284._4_4_;
          fVar232 = fVar246 * fVar259 * auVar284._8_4_;
          fVar234 = fVar189 * fVar182 * auVar284._12_4_;
          fVar224 = fVar151 + fVar87;
          fVar226 = fVar165 + fVar229;
          fVar227 = fVar167 + fVar232;
          fVar292 = fVar168 + fVar234;
          fVar190 = -fVar303 * fVar223 * auVar284._0_4_;
          fVar236 = -fVar247 * fVar233 * auVar284._4_4_;
          fVar228 = -fVar260 * fVar259 * auVar284._8_4_;
          fVar231 = -fVar84 * fVar182 * auVar284._12_4_;
          fVar301 = fVar294 + fVar190;
          fVar271 = fVar295 + fVar236;
          fVar274 = fVar297 + fVar228;
          fVar277 = fVar298 + fVar231;
          fVar273 = fVar223 * 0.0 * auVar284._0_4_;
          fVar276 = fVar233 * 0.0 * auVar284._4_4_;
          fVar278 = fVar259 * 0.0 * auVar284._8_4_;
          fVar287 = fVar182 * 0.0 * auVar284._12_4_;
          fVar233 = fVar170 - fVar191;
          fVar182 = fVar183 - fVar202;
          fVar223 = fVar186 - fVar53;
          fVar259 = fVar188 - fVar86;
          fVar90 = fVar129 + fVar273;
          fVar91 = fVar131 + fVar276;
          fVar128 = fVar132 + fVar278;
          fVar149 = fVar133 + fVar287;
          fVar288 = fVar300 - fVar169;
          fVar171 = fVar261 - fVar185;
          fVar246 = fVar272 - fVar225;
          fVar189 = fVar275 - fVar270;
          fVar303 = fVar134 - fVar289;
          fVar247 = fVar136 - fVar184;
          fVar260 = fVar146 - fVar187;
          fVar84 = fVar148 - fVar205;
          uVar47 = -(uint)(0.0 < (fVar288 * (fVar90 - fVar303) - fVar303 * (fVar301 - fVar288)) *
                                 0.0 + (fVar303 * (fVar224 - fVar233) - (fVar90 - fVar303) * fVar233
                                       ) * 0.0 + ((fVar301 - fVar288) * fVar233 -
                                                 (fVar224 - fVar233) * fVar288));
          uVar48 = -(uint)(0.0 < (fVar171 * (fVar91 - fVar247) - fVar247 * (fVar271 - fVar171)) *
                                 0.0 + (fVar247 * (fVar226 - fVar182) - (fVar91 - fVar247) * fVar182
                                       ) * 0.0 + ((fVar271 - fVar171) * fVar182 -
                                                 (fVar226 - fVar182) * fVar171));
          uVar50 = -(uint)(0.0 < (fVar246 * (fVar128 - fVar260) - fVar260 * (fVar274 - fVar246)) *
                                 0.0 + (fVar260 * (fVar227 - fVar223) -
                                       (fVar128 - fVar260) * fVar223) * 0.0 +
                                       ((fVar274 - fVar246) * fVar223 -
                                       (fVar227 - fVar223) * fVar246));
          uVar49 = -(uint)(0.0 < (fVar189 * (fVar149 - fVar84) - fVar84 * (fVar277 - fVar189)) * 0.0
                                 + (fVar84 * (fVar292 - fVar259) - (fVar149 - fVar84) * fVar259) *
                                   0.0 + ((fVar277 - fVar189) * fVar259 -
                                         (fVar292 - fVar259) * fVar189));
          fVar235 = (float)((uint)(fVar151 - fVar87) & uVar47 | ~uVar47 & (uint)(fVar170 + fVar191))
          ;
          fVar229 = (float)((uint)(fVar165 - fVar229) & uVar48 | ~uVar48 & (uint)(fVar183 + fVar202)
                           );
          fVar232 = (float)((uint)(fVar167 - fVar232) & uVar50 | ~uVar50 & (uint)(fVar186 + fVar53))
          ;
          fVar234 = (float)((uint)(fVar168 - fVar234) & uVar49 | ~uVar49 & (uint)(fVar188 + fVar86))
          ;
          fVar87 = (float)((uint)(fVar294 - fVar190) & uVar47 | ~uVar47 & (uint)(fVar300 + fVar169))
          ;
          fVar151 = (float)((uint)(fVar295 - fVar236) & uVar48 | ~uVar48 & (uint)(fVar261 + fVar185)
                           );
          fVar165 = (float)((uint)(fVar297 - fVar228) & uVar50 | ~uVar50 & (uint)(fVar272 + fVar225)
                           );
          fVar167 = (float)((uint)(fVar298 - fVar231) & uVar49 | ~uVar49 & (uint)(fVar275 + fVar270)
                           );
          fVar273 = (float)((uint)(fVar129 - fVar273) & uVar47 | ~uVar47 & (uint)(fVar134 + fVar289)
                           );
          fVar276 = (float)((uint)(fVar131 - fVar276) & uVar48 | ~uVar48 & (uint)(fVar136 + fVar184)
                           );
          fVar278 = (float)((uint)(fVar132 - fVar278) & uVar50 | ~uVar50 & (uint)(fVar146 + fVar187)
                           );
          fVar287 = (float)((uint)(fVar133 - fVar287) & uVar49 | ~uVar49 & (uint)(fVar148 + fVar205)
                           );
          fVar169 = (float)((uint)fVar233 & uVar47 | ~uVar47 & (uint)fVar224);
          fVar185 = (float)((uint)fVar182 & uVar48 | ~uVar48 & (uint)fVar226);
          fVar225 = (float)((uint)fVar223 & uVar50 | ~uVar50 & (uint)fVar227);
          fVar270 = (float)((uint)fVar259 & uVar49 | ~uVar49 & (uint)fVar292);
          fVar289 = (float)((uint)fVar288 & uVar47 | ~uVar47 & (uint)fVar301);
          fVar184 = (float)((uint)fVar171 & uVar48 | ~uVar48 & (uint)fVar271);
          fVar187 = (float)((uint)fVar246 & uVar50 | ~uVar50 & (uint)fVar274);
          fVar205 = (float)((uint)fVar189 & uVar49 | ~uVar49 & (uint)fVar277);
          fVar191 = (float)((uint)fVar303 & uVar47 | ~uVar47 & (uint)fVar90);
          fVar202 = (float)((uint)fVar247 & uVar48 | ~uVar48 & (uint)fVar91);
          fVar53 = (float)((uint)fVar260 & uVar50 | ~uVar50 & (uint)fVar128);
          fVar86 = (float)((uint)fVar84 & uVar49 | ~uVar49 & (uint)fVar149);
          fVar168 = (float)((uint)fVar224 & uVar47 | ~uVar47 & (uint)fVar233) - fVar235;
          fVar170 = (float)((uint)fVar226 & uVar48 | ~uVar48 & (uint)fVar182) - fVar229;
          fVar183 = (float)((uint)fVar227 & uVar50 | ~uVar50 & (uint)fVar223) - fVar232;
          fVar186 = (float)((uint)fVar292 & uVar49 | ~uVar49 & (uint)fVar259) - fVar234;
          fVar288 = (float)((uint)fVar301 & uVar47 | ~uVar47 & (uint)fVar288) - fVar87;
          fVar171 = (float)((uint)fVar271 & uVar48 | ~uVar48 & (uint)fVar171) - fVar151;
          fVar246 = (float)((uint)fVar274 & uVar50 | ~uVar50 & (uint)fVar246) - fVar165;
          fVar189 = (float)((uint)fVar277 & uVar49 | ~uVar49 & (uint)fVar189) - fVar167;
          fVar303 = (float)((uint)fVar90 & uVar47 | ~uVar47 & (uint)fVar303) - fVar273;
          fVar247 = (float)((uint)fVar91 & uVar48 | ~uVar48 & (uint)fVar247) - fVar276;
          fVar260 = (float)((uint)fVar128 & uVar50 | ~uVar50 & (uint)fVar260) - fVar278;
          fVar84 = (float)((uint)fVar149 & uVar49 | ~uVar49 & (uint)fVar84) - fVar287;
          fVar292 = fVar235 - fVar169;
          fVar294 = fVar229 - fVar185;
          fVar295 = fVar232 - fVar225;
          fVar297 = fVar234 - fVar270;
          fVar190 = fVar87 - fVar289;
          fVar236 = fVar151 - fVar184;
          fVar228 = fVar165 - fVar187;
          fVar231 = fVar167 - fVar205;
          fVar233 = fVar273 - fVar191;
          fVar182 = fVar276 - fVar202;
          fVar223 = fVar278 - fVar53;
          fVar259 = fVar287 - fVar86;
          fVar188 = (fVar87 * fVar303 - fVar273 * fVar288) * 0.0 +
                    (fVar273 * fVar168 - fVar235 * fVar303) * 0.0 +
                    (fVar235 * fVar288 - fVar87 * fVar168);
          fVar224 = (fVar151 * fVar247 - fVar276 * fVar171) * 0.0 +
                    (fVar276 * fVar170 - fVar229 * fVar247) * 0.0 +
                    (fVar229 * fVar171 - fVar151 * fVar170);
          auVar159._4_4_ = fVar224;
          auVar159._0_4_ = fVar188;
          fVar226 = (fVar165 * fVar260 - fVar278 * fVar246) * 0.0 +
                    (fVar278 * fVar183 - fVar232 * fVar260) * 0.0 +
                    (fVar232 * fVar246 - fVar165 * fVar183);
          fVar227 = (fVar167 * fVar84 - fVar287 * fVar189) * 0.0 +
                    (fVar287 * fVar186 - fVar234 * fVar84) * 0.0 +
                    (fVar234 * fVar189 - fVar167 * fVar186);
          auVar291._0_4_ =
               (fVar289 * fVar233 - fVar191 * fVar190) * 0.0 +
               (fVar191 * fVar292 - fVar169 * fVar233) * 0.0 +
               (fVar169 * fVar190 - fVar289 * fVar292);
          auVar291._4_4_ =
               (fVar184 * fVar182 - fVar202 * fVar236) * 0.0 +
               (fVar202 * fVar294 - fVar185 * fVar182) * 0.0 +
               (fVar185 * fVar236 - fVar184 * fVar294);
          auVar291._8_4_ =
               (fVar187 * fVar223 - fVar53 * fVar228) * 0.0 +
               (fVar53 * fVar295 - fVar225 * fVar223) * 0.0 +
               (fVar225 * fVar228 - fVar187 * fVar295);
          auVar291._12_4_ =
               (fVar205 * fVar259 - fVar86 * fVar231) * 0.0 +
               (fVar86 * fVar297 - fVar270 * fVar259) * 0.0 +
               (fVar270 * fVar231 - fVar205 * fVar297);
          auVar159._8_4_ = fVar226;
          auVar159._12_4_ = fVar227;
          auVar54 = maxps(auVar159,auVar291);
          bVar30 = auVar54._0_4_ <= 0.0 && bVar30;
          auVar160._0_4_ = -(uint)bVar30;
          bVar31 = auVar54._4_4_ <= 0.0 && bVar31;
          auVar160._4_4_ = -(uint)bVar31;
          bVar29 = auVar54._8_4_ <= 0.0 && bVar29;
          auVar160._8_4_ = -(uint)bVar29;
          bVar28 = auVar54._12_4_ <= 0.0 && bVar28;
          auVar160._12_4_ = -(uint)bVar28;
          iVar32 = movmskps((int)puVar35,auVar160);
          if (iVar32 == 0) {
            auVar141._8_8_ = uStack_3f0;
            auVar141._0_8_ = local_3f8;
            iVar32 = 0;
          }
          else {
            fVar225 = fVar190 * fVar303 - fVar233 * fVar288;
            fVar270 = fVar236 * fVar247 - fVar182 * fVar171;
            fVar289 = fVar228 * fVar260 - fVar223 * fVar246;
            fVar184 = fVar231 * fVar84 - fVar259 * fVar189;
            fVar169 = fVar233 * fVar168 - fVar303 * fVar292;
            fVar182 = fVar182 * fVar170 - fVar247 * fVar294;
            fVar185 = fVar223 * fVar183 - fVar260 * fVar295;
            fVar223 = fVar259 * fVar186 - fVar84 * fVar297;
            fVar190 = fVar292 * fVar288 - fVar190 * fVar168;
            fVar259 = fVar294 * fVar171 - fVar236 * fVar170;
            fVar288 = fVar295 * fVar246 - fVar228 * fVar183;
            fVar171 = fVar297 * fVar189 - fVar231 * fVar186;
            auVar140._0_4_ = fVar169 * 0.0 + fVar190;
            auVar140._4_4_ = fVar182 * 0.0 + fVar259;
            auVar140._8_4_ = fVar185 * 0.0 + fVar288;
            auVar140._12_4_ = fVar223 * 0.0 + fVar171;
            auVar222._0_4_ = fVar225 * 0.0 + auVar140._0_4_;
            auVar222._4_4_ = fVar270 * 0.0 + auVar140._4_4_;
            auVar222._8_4_ = fVar289 * 0.0 + auVar140._8_4_;
            auVar222._12_4_ = fVar184 * 0.0 + auVar140._12_4_;
            auVar54 = rcpps(auVar140,auVar222);
            fVar236 = auVar54._0_4_;
            fVar228 = auVar54._4_4_;
            fVar231 = auVar54._8_4_;
            fVar233 = auVar54._12_4_;
            fVar236 = (1.0 - auVar222._0_4_ * fVar236) * fVar236 + fVar236;
            fVar228 = (1.0 - auVar222._4_4_ * fVar228) * fVar228 + fVar228;
            fVar231 = (1.0 - auVar222._8_4_ * fVar231) * fVar231 + fVar231;
            fVar233 = (1.0 - auVar222._12_4_ * fVar233) * fVar233 + fVar233;
            fVar169 = (fVar273 * fVar190 + fVar87 * fVar169 + fVar235 * fVar225) * fVar236;
            fVar182 = (fVar276 * fVar259 + fVar151 * fVar182 + fVar229 * fVar270) * fVar228;
            fVar185 = (fVar278 * fVar288 + fVar165 * fVar185 + fVar232 * fVar289) * fVar231;
            fVar223 = (fVar287 * fVar171 + fVar167 * fVar223 + fVar234 * fVar184) * fVar233;
            fVar190 = *(float *)(ray + k * 4 + 0x80);
            bVar30 = (fVar169 <= fVar190 && fVar150 <= fVar169) && bVar30;
            auVar180._0_4_ = -(uint)bVar30;
            bVar31 = (fVar182 <= fVar190 && fVar150 <= fVar182) && bVar31;
            auVar180._4_4_ = -(uint)bVar31;
            bVar29 = (fVar185 <= fVar190 && fVar150 <= fVar185) && bVar29;
            auVar180._8_4_ = -(uint)bVar29;
            bVar28 = (fVar223 <= fVar190 && fVar150 <= fVar223) && bVar28;
            auVar180._12_4_ = -(uint)bVar28;
            iVar32 = movmskps(iVar32,auVar180);
            if (iVar32 == 0) {
              auVar141._8_8_ = uStack_3f0;
              auVar141._0_8_ = local_3f8;
              iVar32 = 0;
            }
            else {
              auVar181._0_8_ =
                   CONCAT44(-(uint)(auVar222._4_4_ != 0.0 && bVar31),
                            -(uint)(auVar222._0_4_ != 0.0 && bVar30));
              auVar181._8_4_ = -(uint)(auVar222._8_4_ != 0.0 && bVar29);
              auVar181._12_4_ = -(uint)(auVar222._12_4_ != 0.0 && bVar28);
              iVar32 = movmskps(iVar32,auVar181);
              auVar141._8_8_ = uStack_3f0;
              auVar141._0_8_ = local_3f8;
              if (iVar32 != 0) {
                fVar188 = fVar188 * fVar236;
                fVar224 = fVar224 * fVar228;
                fVar226 = fVar226 * fVar231;
                fVar227 = fVar227 * fVar233;
                local_4d8 = (float)((uint)(1.0 - fVar188) & uVar47 | ~uVar47 & (uint)fVar188);
                fStack_4d4 = (float)((uint)(1.0 - fVar224) & uVar48 | ~uVar48 & (uint)fVar224);
                fStack_4d0 = (float)((uint)(1.0 - fVar226) & uVar50 | ~uVar50 & (uint)fVar226);
                fStack_4cc = (float)((uint)(1.0 - fVar227) & uVar49 | ~uVar49 & (uint)fVar227);
                local_268 = (float)(~uVar47 & (uint)(auVar291._0_4_ * fVar236) |
                                   (uint)(1.0 - auVar291._0_4_ * fVar236) & uVar47);
                fStack_264 = (float)(~uVar48 & (uint)(auVar291._4_4_ * fVar228) |
                                    (uint)(1.0 - auVar291._4_4_ * fVar228) & uVar48);
                fStack_260 = (float)(~uVar50 & (uint)(auVar291._8_4_ * fVar231) |
                                    (uint)(1.0 - auVar291._8_4_ * fVar231) & uVar50);
                fStack_25c = (float)(~uVar49 & (uint)(auVar291._12_4_ * fVar233) |
                                    (uint)(1.0 - auVar291._12_4_ * fVar233) & uVar49);
                auVar141._8_4_ = auVar181._8_4_;
                auVar141._0_8_ = auVar181._0_8_;
                auVar141._12_4_ = auVar181._12_4_;
                local_378 = fVar169;
                fStack_374 = fVar182;
                fStack_370 = fVar185;
                fStack_36c = fVar223;
              }
            }
          }
          uVar47 = movmskps(iVar32,auVar141);
          puVar35 = (undefined1 *)(ulong)uVar47;
          if (uVar47 != 0) {
            fVar236 = (auVar284._0_4_ - auVar158._0_4_) * local_4d8 + auVar158._0_4_;
            fVar228 = (auVar284._4_4_ - auVar158._4_4_) * fStack_4d4 + auVar158._4_4_;
            fVar231 = (auVar284._8_4_ - auVar158._8_4_) * fStack_4d0 + auVar158._8_4_;
            fVar233 = (auVar284._12_4_ - auVar158._12_4_) * fStack_4cc + auVar158._12_4_;
            fVar190 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            valid.field_0.i[0] = -(uint)(fVar190 * (fVar236 + fVar236) < local_378) & auVar141._0_4_
            ;
            valid.field_0.i[1] =
                 -(uint)(fVar190 * (fVar228 + fVar228) < fStack_374) & auVar141._4_4_;
            valid.field_0.i[2] =
                 -(uint)(fVar190 * (fVar231 + fVar231) < fStack_370) & auVar141._8_4_;
            valid.field_0.i[3] =
                 -(uint)(fVar190 * (fVar233 + fVar233) < fStack_36c) & auVar141._12_4_;
            uVar47 = movmskps(uVar47,(undefined1  [16])valid.field_0);
            puVar35 = (undefined1 *)(ulong)uVar47;
            if (uVar47 != 0) {
              local_268 = local_268 + local_268 + -1.0;
              fStack_264 = fStack_264 + fStack_264 + -1.0;
              fStack_260 = fStack_260 + fStack_260 + -1.0;
              fStack_25c = fStack_25c + fStack_25c + -1.0;
              bhit.U.field_0.v[0] = local_4d8;
              bhit.U.field_0.v[1] = fStack_4d4;
              bhit.U.field_0.v[2] = fStack_4d0;
              bhit.U.field_0.v[3] = fStack_4cc;
              bhit.T.field_0.v[1] = fStack_374;
              bhit.T.field_0.v[0] = local_378;
              bhit.T.field_0.v[2] = fStack_370;
              bhit.T.field_0.v[3] = fStack_36c;
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_3d4,local_3d8);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fStack_3cc,fStack_3d0);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_3e4,local_3e8);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fStack_3dc,fStack_3e0);
              pGVar6 = (context->scene->geometries).items[uVar46].ptr;
              uVar47 = *(uint *)(ray + k * 4 + 0x90);
              puVar35 = (undefined1 *)(ulong)uVar47;
              if ((pGVar6->mask & uVar47) != 0) {
                fVar190 = (float)bhit.i;
                bhit.vu.field_0.v[0] = (fVar190 + local_4d8 + 0.0) * local_78;
                bhit.vu.field_0.v[1] = (fVar190 + fStack_4d4 + 1.0) * fStack_74;
                bhit.vu.field_0.v[2] = (fVar190 + fStack_4d0 + 2.0) * fStack_70;
                bhit.vu.field_0.v[3] = (fVar190 + fStack_4cc + 3.0) * fStack_6c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_264,local_268);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_25c,fStack_260);
                bhit.vt.field_0.v[1] = fStack_374;
                bhit.vt.field_0.v[0] = local_378;
                bhit.vt.field_0.v[2] = fStack_370;
                bhit.vt.field_0.v[3] = fStack_36c;
                auVar113._0_4_ = valid.field_0.i[0] & (uint)local_378;
                auVar113._4_4_ = valid.field_0.i[1] & (uint)fStack_374;
                auVar113._8_4_ = valid.field_0.i[2] & (uint)fStack_370;
                auVar113._12_4_ = valid.field_0.i[3] & (uint)fStack_36c;
                auVar142._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar142._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar142._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar142 = auVar142 | auVar113;
                auVar161._4_4_ = auVar142._0_4_;
                auVar161._0_4_ = auVar142._4_4_;
                auVar161._8_4_ = auVar142._12_4_;
                auVar161._12_4_ = auVar142._8_4_;
                auVar54 = minps(auVar161,auVar142);
                auVar114._0_8_ = auVar54._8_8_;
                auVar114._8_4_ = auVar54._0_4_;
                auVar114._12_4_ = auVar54._4_4_;
                auVar54 = minps(auVar114,auVar54);
                auVar115._0_8_ =
                     CONCAT44(-(uint)(auVar54._4_4_ == auVar142._4_4_) & valid.field_0.i[1],
                              -(uint)(auVar54._0_4_ == auVar142._0_4_) & valid.field_0.i[0]);
                auVar115._8_4_ = -(uint)(auVar54._8_4_ == auVar142._8_4_) & valid.field_0.i[2];
                auVar115._12_4_ = -(uint)(auVar54._12_4_ == auVar142._12_4_) & valid.field_0.i[3];
                iVar32 = movmskps(uVar47,auVar115);
                aVar77 = valid.field_0;
                if (iVar32 != 0) {
                  aVar77.i[2] = auVar115._8_4_;
                  aVar77._0_8_ = auVar115._0_8_;
                  aVar77.i[3] = auVar115._12_4_;
                }
                uVar47 = movmskps(iVar32,(undefined1  [16])aVar77);
                lVar41 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar190 = bhit.vu.field_0.v[lVar41];
                  fVar228 = 1.0 - fVar190;
                  fVar236 = fVar190 * 3.0;
                  fVar169 = ((fVar236 + 2.0) * (fVar228 + fVar228) + fVar228 * -3.0 * fVar228) * 0.5
                  ;
                  fVar231 = (fVar228 * -2.0 * fVar190 + fVar190 * fVar190) * 0.5;
                  fVar233 = (fVar190 * fVar236 + (fVar236 + -5.0) * (fVar190 + fVar190)) * 0.5;
                  fVar236 = bhit.vv.field_0.v[lVar41];
                  fVar228 = (fVar190 * (fVar228 + fVar228) - fVar228 * fVar228) * 0.5;
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar41];
                  *(float *)(ray + k * 4 + 0xc0) =
                       fVar228 * fVar166 +
                       fVar233 * fVar89 + fVar169 * local_3d8 + fVar231 * local_3e8;
                  *(float *)(ray + k * 4 + 0xd0) =
                       fVar228 * fVar52 +
                       fVar233 * fVar127 + fVar169 * fStack_3d4 + fVar231 * fStack_3e4;
                  *(float *)(ray + k * 4 + 0xe0) =
                       fVar228 * fVar83 +
                       fVar233 * fVar130 + fVar169 * fStack_3d0 + fVar231 * fStack_3e0;
                  *(float *)(ray + k * 4 + 0xf0) = fVar190;
                  *(float *)(ray + k * 4 + 0x100) = fVar236;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_400;
                  *(uint *)(ray + k * 4 + 0x120) = uVar46;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar47 = context->user->instPrimID[0];
                  puVar35 = (undefined1 *)(ulong)uVar47;
                  *(uint *)(ray + k * 4 + 0x140) = uVar47;
                  pLVar40 = local_418;
                  pre = local_410;
                  prim = local_408;
                }
                else {
                  auVar12 = *(undefined1 (*) [12])*(undefined1 (*) [16])(mm_lookupmask_ps + lVar39);
                  uStack_4dc = (undefined4)
                               ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar39 + 8) >> 0x20);
                  _local_4f8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  bhit.V.field_0.v[0] = local_268;
                  bhit.V.field_0.v[1] = fStack_264;
                  bhit.V.field_0.v[2] = fStack_260;
                  bhit.V.field_0.v[3] = fStack_25c;
                  bhit.N = iVar5;
                  bhit.curve3D.v0.field_0._0_8_ = uVar9;
                  bhit.curve3D.v0.field_0._8_8_ = uVar27;
                  bhit.curve3D.v1.field_0.m128[0] = fVar89;
                  bhit.curve3D.v1.field_0.m128[1] = fVar127;
                  bhit.curve3D.v1.field_0.m128[2] = fVar130;
                  bhit.curve3D.v1.field_0.m128[3] = fVar135;
                  bhit.valid.field_0 = valid.field_0;
                  while( true ) {
                    local_d8 = bhit.vu.field_0.v[lVar41];
                    local_c8 = bhit.vv.field_0.v[lVar41];
                    *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar41];
                    fVar233 = 1.0 - local_d8;
                    fVar190 = local_d8 * 3.0;
                    fVar231 = ((fVar190 + 2.0) * (fVar233 + fVar233) + fVar233 * -3.0 * fVar233) *
                              0.5;
                    fVar236 = (local_d8 * local_d8 + fVar233 * -2.0 * local_d8) * 0.5;
                    fVar228 = (local_d8 * fVar190 + (fVar190 + -5.0) * (local_d8 + local_d8)) * 0.5;
                    args.context = context->user;
                    fVar190 = (local_d8 * (fVar233 + fVar233) - fVar233 * fVar233) * 0.5;
                    local_108 = fVar190 * fVar166 +
                                fVar228 * fVar89 + fVar231 * local_3d8 + fVar236 * local_3e8;
                    local_f8 = fVar190 * fVar52 +
                               fVar228 * fVar127 + fVar231 * fStack_3d4 + fVar236 * fStack_3e4;
                    local_e8 = fVar190 * fVar83 +
                               fVar228 * fVar130 + fVar231 * fStack_3d0 + fVar236 * fStack_3e0;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    fStack_c4 = local_c8;
                    fStack_c0 = local_c8;
                    fStack_bc = local_c8;
                    local_b8 = local_2e8;
                    uStack_b0 = uStack_2e0;
                    local_a8 = CONCAT44(uStack_64,local_68);
                    uStack_a0 = CONCAT44(uStack_5c,uStack_60);
                    local_98 = (args.context)->instID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_88 = (args.context)->instPrimID[0];
                    uStack_84 = local_88;
                    uStack_80 = local_88;
                    uStack_7c = local_88;
                    local_428._12_4_ = uStack_4dc;
                    local_428._0_12_ = auVar12;
                    args.valid = (int *)local_428;
                    args.geometryUserPtr = pGVar6->userPtr;
                    args.hit = (RTCHitN *)&local_108;
                    args.N = 4;
                    p_Var36 = pGVar6->intersectionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var36 != (RTCFilterFunctionN)0x0) {
                      p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&args);
                    }
                    auVar116._0_4_ = -(uint)(local_428._0_4_ == 0);
                    auVar116._4_4_ = -(uint)(local_428._4_4_ == 0);
                    auVar116._8_4_ = -(uint)(local_428._8_4_ == 0);
                    auVar116._12_4_ = -(uint)(local_428._12_4_ == 0);
                    uVar47 = movmskps((int)p_Var36,auVar116);
                    pRVar37 = (RTCRayN *)(ulong)(uVar47 ^ 0xf);
                    if ((uVar47 ^ 0xf) == 0) {
                      auVar116 = auVar116 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var36 = context->args->filter;
                      if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&args);
                      }
                      auVar78._0_4_ = -(uint)(local_428._0_4_ == 0);
                      auVar78._4_4_ = -(uint)(local_428._4_4_ == 0);
                      auVar78._8_4_ = -(uint)(local_428._8_4_ == 0);
                      auVar78._12_4_ = -(uint)(local_428._12_4_ == 0);
                      auVar116 = auVar78 ^ _DAT_01f46b70;
                      uVar47 = movmskps((int)p_Var36,auVar78);
                      pRVar37 = (RTCRayN *)(ulong)(uVar47 ^ 0xf);
                      if ((uVar47 ^ 0xf) != 0) {
                        uVar47 = *(uint *)(args.hit + 4);
                        uVar48 = *(uint *)(args.hit + 8);
                        uVar50 = *(uint *)(args.hit + 0xc);
                        *(uint *)(args.ray + 0xc0) =
                             ~auVar78._0_4_ & *(uint *)args.hit |
                             *(uint *)(args.ray + 0xc0) & auVar78._0_4_;
                        *(uint *)(args.ray + 0xc4) =
                             ~auVar78._4_4_ & uVar47 | *(uint *)(args.ray + 0xc4) & auVar78._4_4_;
                        *(uint *)(args.ray + 200) =
                             ~auVar78._8_4_ & uVar48 | *(uint *)(args.ray + 200) & auVar78._8_4_;
                        *(uint *)(args.ray + 0xcc) =
                             ~auVar78._12_4_ & uVar50 | *(uint *)(args.ray + 0xcc) & auVar78._12_4_;
                        uVar47 = *(uint *)(args.hit + 0x14);
                        uVar48 = *(uint *)(args.hit + 0x18);
                        uVar50 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar78._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar78._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar78._4_4_ & uVar47 | *(uint *)(args.ray + 0xd4) & auVar78._4_4_;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar78._8_4_ & uVar48 | *(uint *)(args.ray + 0xd8) & auVar78._8_4_;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar78._12_4_ & uVar50 | *(uint *)(args.ray + 0xdc) & auVar78._12_4_;
                        uVar47 = *(uint *)(args.hit + 0x24);
                        uVar48 = *(uint *)(args.hit + 0x28);
                        uVar50 = *(uint *)(args.hit + 0x2c);
                        *(uint *)(args.ray + 0xe0) =
                             ~auVar78._0_4_ & *(uint *)(args.hit + 0x20) |
                             *(uint *)(args.ray + 0xe0) & auVar78._0_4_;
                        *(uint *)(args.ray + 0xe4) =
                             ~auVar78._4_4_ & uVar47 | *(uint *)(args.ray + 0xe4) & auVar78._4_4_;
                        *(uint *)(args.ray + 0xe8) =
                             ~auVar78._8_4_ & uVar48 | *(uint *)(args.ray + 0xe8) & auVar78._8_4_;
                        *(uint *)(args.ray + 0xec) =
                             ~auVar78._12_4_ & uVar50 | *(uint *)(args.ray + 0xec) & auVar78._12_4_;
                        uVar47 = *(uint *)(args.hit + 0x34);
                        uVar48 = *(uint *)(args.hit + 0x38);
                        uVar50 = *(uint *)(args.hit + 0x3c);
                        *(uint *)(args.ray + 0xf0) =
                             ~auVar78._0_4_ & *(uint *)(args.hit + 0x30) |
                             *(uint *)(args.ray + 0xf0) & auVar78._0_4_;
                        *(uint *)(args.ray + 0xf4) =
                             ~auVar78._4_4_ & uVar47 | *(uint *)(args.ray + 0xf4) & auVar78._4_4_;
                        *(uint *)(args.ray + 0xf8) =
                             ~auVar78._8_4_ & uVar48 | *(uint *)(args.ray + 0xf8) & auVar78._8_4_;
                        *(uint *)(args.ray + 0xfc) =
                             ~auVar78._12_4_ & uVar50 | *(uint *)(args.ray + 0xfc) & auVar78._12_4_;
                        uVar47 = *(uint *)(args.hit + 0x44);
                        uVar48 = *(uint *)(args.hit + 0x48);
                        uVar50 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar78._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar78._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar78._4_4_ & uVar47 | *(uint *)(args.ray + 0x104) & auVar78._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar78._8_4_ & uVar48 | *(uint *)(args.ray + 0x108) & auVar78._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar78._12_4_ & uVar50 | *(uint *)(args.ray + 0x10c) & auVar78._12_4_
                        ;
                        uVar47 = *(uint *)(args.hit + 0x54);
                        uVar48 = *(uint *)(args.hit + 0x58);
                        uVar50 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar78._0_4_ |
                             ~auVar78._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar78._4_4_ | ~auVar78._4_4_ & uVar47;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar78._8_4_ | ~auVar78._8_4_ & uVar48;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar78._12_4_ | ~auVar78._12_4_ & uVar50
                        ;
                        uVar47 = *(uint *)(args.hit + 100);
                        uVar48 = *(uint *)(args.hit + 0x68);
                        uVar50 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar78._0_4_ |
                             ~auVar78._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar78._4_4_ | ~auVar78._4_4_ & uVar47;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar78._8_4_ | ~auVar78._8_4_ & uVar48;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar78._12_4_ | ~auVar78._12_4_ & uVar50;
                        uVar47 = *(uint *)(args.hit + 0x74);
                        uVar48 = *(uint *)(args.hit + 0x78);
                        uVar50 = *(uint *)(args.hit + 0x7c);
                        *(uint *)(args.ray + 0x130) =
                             ~auVar78._0_4_ & *(uint *)(args.hit + 0x70) |
                             *(uint *)(args.ray + 0x130) & auVar78._0_4_;
                        *(uint *)(args.ray + 0x134) =
                             ~auVar78._4_4_ & uVar47 | *(uint *)(args.ray + 0x134) & auVar78._4_4_;
                        *(uint *)(args.ray + 0x138) =
                             ~auVar78._8_4_ & uVar48 | *(uint *)(args.ray + 0x138) & auVar78._8_4_;
                        *(uint *)(args.ray + 0x13c) =
                             ~auVar78._12_4_ & uVar50 | *(uint *)(args.ray + 0x13c) & auVar78._12_4_
                        ;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar78 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar78;
                        pRVar37 = args.ray;
                      }
                    }
                    auVar117._0_4_ = auVar116._0_4_ << 0x1f;
                    auVar117._4_4_ = auVar116._4_4_ << 0x1f;
                    auVar117._8_4_ = auVar116._8_4_ << 0x1f;
                    auVar117._12_4_ = auVar116._12_4_ << 0x1f;
                    uVar38 = (undefined4)((ulong)pRVar37 >> 0x20);
                    iVar32 = movmskps((int)pRVar37,auVar117);
                    if (iVar32 == 0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_4f8._0_4_;
                    }
                    else {
                      local_4f8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_4f8._4_4_ = 0;
                      uStack_4f0._0_4_ = 0.0;
                      uStack_4f0._4_4_ = 0;
                    }
                    *(undefined4 *)(local_428 + lVar41 * 4 + -0x10) = 0;
                    valid.field_0.i[0] =
                         -(uint)(local_378 <= (float)local_4f8._0_4_) & valid.field_0.i[0];
                    valid.field_0.i[1] =
                         -(uint)(fStack_374 <= (float)local_4f8._0_4_) & valid.field_0.i[1];
                    valid.field_0.i[2] =
                         -(uint)(fStack_370 <= (float)local_4f8._0_4_) & valid.field_0.i[2];
                    valid.field_0.i[3] =
                         -(uint)(fStack_36c <= (float)local_4f8._0_4_) & valid.field_0.i[3];
                    iVar32 = movmskps(iVar32,(undefined1  [16])valid.field_0);
                    puVar35 = (undefined1 *)CONCAT44(uVar38,iVar32);
                    pLVar40 = local_418;
                    pre = local_410;
                    prim = local_408;
                    if (iVar32 == 0) break;
                    auVar118._0_4_ = valid.field_0.i[0] & (uint)local_378;
                    auVar118._4_4_ = valid.field_0.i[1] & (uint)fStack_374;
                    auVar118._8_4_ = valid.field_0.i[2] & (uint)fStack_370;
                    auVar118._12_4_ = valid.field_0.i[3] & (uint)fStack_36c;
                    auVar143._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar143._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar143._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar143 = auVar143 | auVar118;
                    auVar162._4_4_ = auVar143._0_4_;
                    auVar162._0_4_ = auVar143._4_4_;
                    auVar162._8_4_ = auVar143._12_4_;
                    auVar162._12_4_ = auVar143._8_4_;
                    auVar54 = minps(auVar162,auVar143);
                    auVar119._0_8_ = auVar54._8_8_;
                    auVar119._8_4_ = auVar54._0_4_;
                    auVar119._12_4_ = auVar54._4_4_;
                    auVar54 = minps(auVar119,auVar54);
                    auVar120._0_8_ =
                         CONCAT44(-(uint)(auVar54._4_4_ == auVar143._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar54._0_4_ == auVar143._0_4_) & valid.field_0.i[0]);
                    auVar120._8_4_ = -(uint)(auVar54._8_4_ == auVar143._8_4_) & valid.field_0.i[2];
                    auVar120._12_4_ =
                         -(uint)(auVar54._12_4_ == auVar143._12_4_) & valid.field_0.i[3];
                    iVar32 = movmskps(iVar32,auVar120);
                    aVar79 = valid.field_0;
                    if (iVar32 != 0) {
                      aVar79.i[2] = auVar120._8_4_;
                      aVar79._0_8_ = auVar120._0_8_;
                      aVar79.i[3] = auVar120._12_4_;
                    }
                    uVar33 = movmskps(iVar32,(undefined1  [16])aVar79);
                    uVar34 = CONCAT44(uVar38,uVar33);
                    lVar41 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fVar166 = *(float *)(ray + k * 4 + 0x80);
    auVar112._4_4_ = -(uint)(fStack_44 <= fVar166);
    auVar112._0_4_ = -(uint)(local_48 <= fVar166);
    auVar112._8_4_ = -(uint)(fStack_40 <= fVar166);
    auVar112._12_4_ = -(uint)(fStack_3c <= fVar166);
    uVar46 = movmskps(uVar38,auVar112);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }